

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar76 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar82 [16];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  int iVar124;
  undefined4 uVar125;
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 bi_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar144 [32];
  vfloat4 b0;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar153;
  float fVar164;
  float fVar165;
  vint4 ai;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar166;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar167;
  vint4 ai_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  vint4 ai_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  __m128 a;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar198 [16];
  undefined1 auVar207 [32];
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar213;
  float fVar223;
  float fVar224;
  vfloat4 a0_3;
  undefined1 auVar214 [16];
  float fVar225;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar239;
  vfloat4 b0_2;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  vfloat4 b0_3;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  long local_368;
  Primitive *local_360;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar132 [32];
  float fVar148;
  float fVar152;
  undefined1 auVar251 [32];
  
  uVar22 = (ulong)(byte)prim[1];
  lVar25 = uVar22 * 0x25;
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 4 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 5 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 6 + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xf + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x11 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x1a + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x1b + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0x1c + 6)));
  auVar110._16_16_ = in_YmmResult._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar25 + 0x12)));
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar36 = vsubps_avx512vl(auVar50,*(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar153 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar22 * 7 + 6);
  auVar71 = vpmovsxwd_avx(auVar50);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar22 * 0xb + 6);
  auVar54 = vpmovsxwd_avx(auVar53);
  auVar37 = vpbroadcastd_avx512vl();
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar22 * 9 + 6);
  auVar38 = vpmovsxwd_avx512vl(auVar52);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar22 * 0xd + 6);
  auVar39 = vpmovsxwd_avx512vl(auVar51);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar22 * 0x12 + 6);
  auVar56 = vpmovsxwd_avx(auVar56);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar22 * 0x16 + 6);
  auVar55 = vpmovsxwd_avx(auVar55);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar22 * 0x14 + 6);
  auVar59 = vpmovsxwd_avx(auVar59);
  auVar50 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar50 = vinsertps_avx512f(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar36 = vmulps_avx512vl(auVar35,auVar36);
  auVar35 = vmulps_avx512vl(auVar35,auVar50);
  auVar40 = vcvtdq2ps_avx512vl(auVar46);
  auVar41 = vcvtdq2ps_avx512vl(auVar41);
  auVar42 = vcvtdq2ps_avx512vl(auVar42);
  auVar43 = vcvtdq2ps_avx512vl(auVar43);
  auVar44 = vcvtdq2ps_avx512vl(auVar44);
  auVar263 = ZEXT1664(auVar44);
  auVar50 = vcvtdq2ps_avx(auVar45);
  auVar53 = vcvtdq2ps_avx(auVar47);
  auVar52 = vcvtdq2ps_avx(auVar48);
  auVar51 = vcvtdq2ps_avx(auVar49);
  auVar45 = vbroadcastss_avx512vl(auVar35);
  auVar46 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar47 = vshufps_avx512vl(auVar35,auVar35,0xaa);
  auVar48 = vmulps_avx512vl(auVar47,auVar42);
  auVar60._0_4_ = auVar47._0_4_ * auVar50._0_4_;
  auVar60._4_4_ = auVar47._4_4_ * auVar50._4_4_;
  auVar60._8_4_ = auVar47._8_4_ * auVar50._8_4_;
  auVar60._12_4_ = auVar47._12_4_ * auVar50._12_4_;
  auVar35._0_4_ = auVar51._0_4_ * auVar47._0_4_;
  auVar35._4_4_ = auVar51._4_4_ * auVar47._4_4_;
  auVar35._8_4_ = auVar51._8_4_ * auVar47._8_4_;
  auVar35._12_4_ = auVar51._12_4_ * auVar47._12_4_;
  auVar47 = vfmadd231ps_avx512vl(auVar48,auVar46,auVar41);
  auVar48 = vfmadd231ps_avx512vl(auVar60,auVar46,auVar44);
  auVar46 = vfmadd231ps_fma(auVar35,auVar52,auVar46);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar40);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar45,auVar43);
  auVar46 = vfmadd231ps_fma(auVar46,auVar53,auVar45);
  auVar45 = vbroadcastss_avx512vl(auVar36);
  auVar49 = vshufps_avx512vl(auVar36,auVar36,0x55);
  auVar35 = vshufps_avx512vl(auVar36,auVar36,0xaa);
  auVar42 = vmulps_avx512vl(auVar35,auVar42);
  auVar50 = vmulps_avx512vl(auVar35,auVar50);
  auVar51 = vmulps_avx512vl(auVar35,auVar51);
  auVar41 = vfmadd231ps_avx512vl(auVar42,auVar49,auVar41);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar49,auVar44);
  auVar52 = vfmadd231ps_avx512vl(auVar51,auVar49,auVar52);
  auVar35 = vfmadd231ps_avx512vl(auVar41,auVar45,auVar40);
  auVar36 = vfmadd231ps_avx512vl(auVar50,auVar45,auVar43);
  auVar49 = vfmadd231ps_fma(auVar52,auVar45,auVar53);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar264 = ZEXT1664(auVar50);
  auVar53 = vandps_avx512vl(auVar47,auVar50);
  auVar64._8_4_ = 0x219392ef;
  auVar64._0_8_ = 0x219392ef219392ef;
  auVar64._12_4_ = 0x219392ef;
  uVar27 = vcmpps_avx512vl(auVar53,auVar64,1);
  bVar29 = (bool)((byte)uVar27 & 1);
  auVar40._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._0_4_;
  bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._4_4_;
  bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._8_4_;
  bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar47._12_4_;
  auVar53 = vandps_avx512vl(auVar48,auVar50);
  uVar27 = vcmpps_avx512vl(auVar53,auVar64,1);
  bVar29 = (bool)((byte)uVar27 & 1);
  auVar57._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar48._0_4_;
  bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar48._4_4_;
  bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar48._8_4_;
  bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar48._12_4_;
  auVar50 = vandps_avx512vl(auVar46,auVar50);
  uVar27 = vcmpps_avx512vl(auVar50,auVar64,1);
  bVar29 = (bool)((byte)uVar27 & 1);
  auVar58._0_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._0_4_;
  bVar29 = (bool)((byte)(uVar27 >> 1) & 1);
  auVar58._4_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._4_4_;
  bVar29 = (bool)((byte)(uVar27 >> 2) & 1);
  auVar58._8_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._8_4_;
  bVar29 = (bool)((byte)(uVar27 >> 3) & 1);
  auVar58._12_4_ = (uint)bVar29 * 0x219392ef | (uint)!bVar29 * auVar46._12_4_;
  auVar50 = vrcp14ps_avx512vl(auVar40);
  auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar265 = ZEXT1664(auVar53);
  auVar52 = vfnmadd213ps_avx512vl(auVar40,auVar50,auVar53);
  auVar52 = vfmadd132ps_fma(auVar52,auVar50,auVar50);
  auVar50 = vrcp14ps_avx512vl(auVar57);
  auVar51 = vfnmadd213ps_avx512vl(auVar57,auVar50,auVar53);
  auVar51 = vfmadd132ps_fma(auVar51,auVar50,auVar50);
  auVar50 = vrcp14ps_avx512vl(auVar58);
  auVar53 = vfnmadd213ps_avx512vl(auVar58,auVar50,auVar53);
  auVar45 = vfmadd132ps_fma(auVar53,auVar50,auVar50);
  auVar61._4_4_ = fVar153;
  auVar61._0_4_ = fVar153;
  auVar61._8_4_ = fVar153;
  auVar61._12_4_ = fVar153;
  auVar50 = vcvtdq2ps_avx(auVar71);
  auVar53 = vcvtdq2ps_avx(auVar54);
  auVar53 = vsubps_avx(auVar53,auVar50);
  auVar47 = vfmadd213ps_fma(auVar53,auVar61,auVar50);
  auVar53 = vcvtdq2ps_avx512vl(auVar38);
  auVar50 = vcvtdq2ps_avx512vl(auVar39);
  auVar50 = vsubps_avx(auVar50,auVar53);
  auVar48 = vfmadd213ps_fma(auVar50,auVar61,auVar53);
  auVar50 = vcvtdq2ps_avx(auVar56);
  auVar53 = vcvtdq2ps_avx(auVar55);
  auVar53 = vsubps_avx(auVar53,auVar50);
  auVar56 = vfmadd213ps_fma(auVar53,auVar61,auVar50);
  auVar50 = vcvtdq2ps_avx(auVar59);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar22 * 0x18 + 6);
  auVar53 = vpmovsxwd_avx(auVar46);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar53 = vsubps_avx(auVar53,auVar50);
  auVar55 = vfmadd213ps_fma(auVar53,auVar61,auVar50);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar22 * 0x1d + 6);
  auVar50 = vpmovsxwd_avx(auVar41);
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar22 * 0x21 + 6);
  auVar53 = vpmovsxwd_avx(auVar42);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar53 = vsubps_avx(auVar53,auVar50);
  auVar59 = vfmadd213ps_fma(auVar53,auVar61,auVar50);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar22 * 0x1f + 6);
  auVar50 = vpmovsxwd_avx(auVar43);
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar22 * 0x23 + 6);
  auVar53 = vpmovsxwd_avx(auVar44);
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar53 = vsubps_avx(auVar53,auVar50);
  auVar53 = vfmadd213ps_fma(auVar53,auVar61,auVar50);
  auVar50 = vsubps_avx512vl(auVar47,auVar35);
  auVar62._0_4_ = auVar52._0_4_ * auVar50._0_4_;
  auVar62._4_4_ = auVar52._4_4_ * auVar50._4_4_;
  auVar62._8_4_ = auVar52._8_4_ * auVar50._8_4_;
  auVar62._12_4_ = auVar52._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx512vl(auVar48,auVar35);
  auVar38._0_4_ = auVar52._0_4_ * auVar50._0_4_;
  auVar38._4_4_ = auVar52._4_4_ * auVar50._4_4_;
  auVar38._8_4_ = auVar52._8_4_ * auVar50._8_4_;
  auVar38._12_4_ = auVar52._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar56,auVar36);
  auVar63._0_4_ = auVar51._0_4_ * auVar50._0_4_;
  auVar63._4_4_ = auVar51._4_4_ * auVar50._4_4_;
  auVar63._8_4_ = auVar51._8_4_ * auVar50._8_4_;
  auVar63._12_4_ = auVar51._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar55,auVar36);
  auVar54._0_4_ = auVar51._0_4_ * auVar50._0_4_;
  auVar54._4_4_ = auVar51._4_4_ * auVar50._4_4_;
  auVar54._8_4_ = auVar51._8_4_ * auVar50._8_4_;
  auVar54._12_4_ = auVar51._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar59,auVar49);
  auVar36._0_4_ = auVar45._0_4_ * auVar50._0_4_;
  auVar36._4_4_ = auVar45._4_4_ * auVar50._4_4_;
  auVar36._8_4_ = auVar45._8_4_ * auVar50._8_4_;
  auVar36._12_4_ = auVar45._12_4_ * auVar50._12_4_;
  auVar50 = vsubps_avx(auVar53,auVar49);
  auVar71._0_4_ = auVar45._0_4_ * auVar50._0_4_;
  auVar71._4_4_ = auVar45._4_4_ * auVar50._4_4_;
  auVar71._8_4_ = auVar45._8_4_ * auVar50._8_4_;
  auVar71._12_4_ = auVar45._12_4_ * auVar50._12_4_;
  auVar50 = vpminsd_avx(auVar62,auVar38);
  auVar53 = vpminsd_avx(auVar63,auVar54);
  auVar50 = vmaxps_avx(auVar50,auVar53);
  auVar53 = vpminsd_avx(auVar36,auVar71);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar45._4_4_ = uVar125;
  auVar45._0_4_ = uVar125;
  auVar45._8_4_ = uVar125;
  auVar45._12_4_ = uVar125;
  auVar53 = vmaxps_avx512vl(auVar53,auVar45);
  auVar50 = vmaxps_avx(auVar50,auVar53);
  auVar47._8_4_ = 0x3f7ffffa;
  auVar47._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar47._12_4_ = 0x3f7ffffa;
  auVar52 = vmulps_avx512vl(auVar50,auVar47);
  auVar50 = vpmaxsd_avx(auVar62,auVar38);
  auVar53 = vpmaxsd_avx(auVar63,auVar54);
  auVar50 = vminps_avx(auVar50,auVar53);
  auVar53 = vpmaxsd_avx(auVar36,auVar71);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar48._4_4_ = uVar125;
  auVar48._0_4_ = uVar125;
  auVar48._8_4_ = uVar125;
  auVar48._12_4_ = uVar125;
  auVar53 = vminps_avx512vl(auVar53,auVar48);
  auVar50 = vminps_avx(auVar50,auVar53);
  auVar49._8_4_ = 0x3f800003;
  auVar49._0_8_ = 0x3f8000033f800003;
  auVar49._12_4_ = 0x3f800003;
  auVar50 = vmulps_avx512vl(auVar50,auVar49);
  uVar13 = vcmpps_avx512vl(auVar52,auVar50,2);
  uVar14 = vpcmpgtd_avx512vl(auVar37,_DAT_01f4ad30);
  uVar27 = (ulong)((byte)uVar13 & 0xf & (byte)uVar14);
  auVar50 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar53 = vpxord_avx512vl(auVar39,auVar39);
  auVar260 = ZEXT1664(auVar53);
  auVar110._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar267 = ZEXT1664(auVar110._0_16_);
  local_360 = prim;
LAB_018f7007:
  if (uVar27 == 0) {
LAB_018f8f0d:
    return uVar27 != 0;
  }
  lVar25 = 0;
  for (uVar22 = uVar27; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar5 = *(uint *)(local_360 + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  fVar153 = (pGVar7->time_range).lower;
  fVar224 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar153) / ((pGVar7->time_range).upper - fVar153));
  auVar53 = vroundss_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),9);
  auVar106._16_16_ = auVar110._16_16_;
  auVar51 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar53 = vminss_avx(auVar53,auVar51);
  auVar54 = vmaxss_avx512f(auVar260._0_16_,auVar53);
  uVar22 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_360 + lVar25 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar28 = (long)(int)auVar54._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar28);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar28);
  auVar53 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar22);
  lVar25 = uVar22 + 1;
  auVar51 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar25);
  lVar23 = uVar22 + 2;
  auVar56 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar23);
  lVar1 = uVar22 + 3;
  auVar55 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar28);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar28);
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar22);
  auVar46 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
  auVar41 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar23);
  auVar42 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar28);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar28);
  auVar43 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar22);
  auVar44 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
  auVar45 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar23);
  auVar47 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar39 = vpbroadcastd_avx512vl();
  lVar10 = *(long *)(lVar9 + 0x38 + lVar28);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar28);
  auVar48 = *(undefined1 (*) [16])(lVar10 + uVar22 * lVar9);
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar25 * lVar9);
  auVar71 = *(undefined1 (*) [16])(lVar10 + lVar23 * lVar9);
  fVar224 = fVar224 - auVar54._0_4_;
  auVar106._0_16_ = vxorps_avx512vl(auVar263._0_16_,auVar263._0_16_);
  auVar54 = vmulps_avx512vl(auVar55,auVar106._0_16_);
  auVar68._8_4_ = 0x3e2aaaab;
  auVar68._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar68._12_4_ = 0x3e2aaaab;
  auVar35 = vfmadd213ps_avx512vl(auVar68,auVar56,auVar54);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar51,auVar36);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar53,auVar68);
  auVar60 = auVar267._0_16_;
  auVar54 = vfmadd231ps_avx512vl(auVar54,auVar56,auVar60);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar51,auVar106._0_16_);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar53,auVar60);
  auVar37 = vmulps_avx512vl(auVar42,auVar106._0_16_);
  auVar38 = vfmadd213ps_avx512vl(auVar68,auVar41,auVar37);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar46,auVar36);
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar59,auVar68);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar41,auVar60);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar46,auVar106._0_16_);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar59,auVar60);
  auVar40 = vmulps_avx512vl(auVar55,auVar68);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar56,auVar36);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar51,auVar68);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar53,auVar106._0_16_);
  auVar55 = vmulps_avx512vl(auVar55,auVar60);
  auVar56 = vfmadd231ps_avx512vl(auVar55,auVar106._0_16_,auVar56);
  auVar51 = vfnmadd231ps_avx512vl(auVar56,auVar60,auVar51);
  auVar57 = vfnmadd231ps_avx512vl(auVar51,auVar106._0_16_,auVar53);
  auVar65._0_4_ = auVar42._0_4_ * 0.16666667;
  auVar65._4_4_ = auVar42._4_4_ * 0.16666667;
  auVar65._8_4_ = auVar42._8_4_ * 0.16666667;
  auVar65._12_4_ = auVar42._12_4_ * 0.16666667;
  auVar53 = vfmadd231ps_avx512vl(auVar65,auVar41,auVar36);
  auVar53 = vfmadd231ps_fma(auVar53,auVar46,auVar68);
  auVar58 = vfmadd231ps_avx512vl(auVar53,auVar59,auVar106._0_16_);
  auVar53 = vmulps_avx512vl(auVar42,auVar60);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar106._0_16_,auVar41);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar60,auVar46);
  auVar46 = vfnmadd231ps_avx512vl(auVar53,auVar106._0_16_,auVar59);
  auVar53 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar51 = vshufps_avx512vl(auVar38,auVar38,0xc9);
  fVar139 = auVar54._0_4_;
  auVar84._0_4_ = fVar139 * auVar51._0_4_;
  fVar145 = auVar54._4_4_;
  auVar84._4_4_ = fVar145 * auVar51._4_4_;
  fVar146 = auVar54._8_4_;
  auVar84._8_4_ = fVar146 * auVar51._8_4_;
  fVar147 = auVar54._12_4_;
  auVar84._12_4_ = fVar147 * auVar51._12_4_;
  auVar51 = vfmsub231ps_avx512vl(auVar84,auVar53,auVar38);
  auVar56 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx512vl(auVar37,auVar37,0xc9);
  auVar168._0_4_ = fVar139 * auVar51._0_4_;
  auVar168._4_4_ = fVar145 * auVar51._4_4_;
  auVar168._8_4_ = fVar146 * auVar51._8_4_;
  auVar168._12_4_ = fVar147 * auVar51._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar168,auVar53,auVar37);
  auVar55 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar51 = vshufps_avx(auVar58,auVar58,0xc9);
  fVar167 = auVar57._0_4_;
  auVar184._0_4_ = auVar51._0_4_ * fVar167;
  fVar228 = auVar57._4_4_;
  auVar184._4_4_ = auVar51._4_4_ * fVar228;
  fVar213 = auVar57._8_4_;
  auVar184._8_4_ = auVar51._8_4_ * fVar213;
  fVar223 = auVar57._12_4_;
  auVar184._12_4_ = auVar51._12_4_ * fVar223;
  auVar51 = vfmsub231ps_fma(auVar184,auVar53,auVar58);
  auVar59 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar185._0_4_ = auVar51._0_4_ * fVar167;
  auVar185._4_4_ = auVar51._4_4_ * fVar228;
  auVar185._8_4_ = auVar51._8_4_ * fVar213;
  auVar185._12_4_ = auVar51._12_4_ * fVar223;
  auVar53 = vfmsub231ps_fma(auVar185,auVar53,auVar46);
  auVar46 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar53 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar91._4_28_ = auVar106._4_28_;
  auVar91._0_4_ = auVar53._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar106._0_16_,auVar91._0_16_);
  auVar41 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar42 = vmulss_avx512f(auVar42,auVar51);
  auVar51 = vmulss_avx512f(auVar42,ZEXT416((uint)(auVar51._0_4_ * auVar51._0_4_)));
  auVar51 = vaddss_avx512f(auVar41,auVar51);
  auVar194._0_4_ = auVar51._0_4_;
  auVar194._4_4_ = auVar194._0_4_;
  auVar194._8_4_ = auVar194._0_4_;
  auVar194._12_4_ = auVar194._0_4_;
  auVar41 = vmulps_avx512vl(auVar56,auVar194);
  auVar51 = vdpps_avx(auVar56,auVar55,0x7f);
  auVar42 = vbroadcastss_avx512vl(auVar53);
  auVar55 = vmulps_avx512vl(auVar42,auVar55);
  fVar153 = auVar51._0_4_;
  auVar82._0_4_ = fVar153 * auVar56._0_4_;
  auVar82._4_4_ = fVar153 * auVar56._4_4_;
  auVar82._8_4_ = fVar153 * auVar56._8_4_;
  auVar82._12_4_ = fVar153 * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar55,auVar82);
  auVar51 = vrcp14ss_avx512f(auVar106._0_16_,auVar91._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar51,ZEXT416(0x40000000));
  fVar148 = auVar51._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar109._16_16_ = auVar106._16_16_;
  auVar109._0_16_ = auVar106._0_16_;
  auVar92._4_28_ = auVar109._4_28_;
  auVar92._0_4_ = auVar53._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar106._0_16_,auVar92._0_16_);
  auVar55 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  fVar153 = auVar51._0_4_;
  fVar153 = auVar55._0_4_ + auVar42._0_4_ * fVar153 * fVar153 * fVar153;
  auVar195._0_4_ = fVar153 * auVar59._0_4_;
  auVar195._4_4_ = fVar153 * auVar59._4_4_;
  auVar195._8_4_ = fVar153 * auVar59._8_4_;
  auVar195._12_4_ = fVar153 * auVar59._12_4_;
  auVar51 = vdpps_avx(auVar59,auVar46,0x7f);
  auVar55 = vbroadcastss_avx512vl(auVar53);
  auVar55 = vmulps_avx512vl(auVar55,auVar46);
  fVar152 = auVar51._0_4_;
  auVar66._0_4_ = fVar152 * auVar59._0_4_;
  auVar66._4_4_ = fVar152 * auVar59._4_4_;
  auVar66._8_4_ = fVar152 * auVar59._8_4_;
  auVar66._12_4_ = fVar152 * auVar59._12_4_;
  auVar51 = vsubps_avx(auVar55,auVar66);
  auVar55 = vrcp14ss_avx512f(auVar106._0_16_,auVar92._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar55,ZEXT416(0x40000000));
  fVar152 = auVar55._0_4_ * auVar53._0_4_;
  auVar55 = vshufps_avx512vl(auVar35,auVar35,0xff);
  auVar59 = vmulps_avx512vl(auVar55,auVar41);
  auVar42 = vsubps_avx512vl(auVar35,auVar59);
  auVar53 = vshufps_avx(auVar54,auVar54,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar41);
  auVar81._0_4_ = auVar53._0_4_ + auVar55._0_4_ * auVar194._0_4_ * fVar148 * auVar56._0_4_;
  auVar81._4_4_ = auVar53._4_4_ + auVar55._4_4_ * auVar194._0_4_ * fVar148 * auVar56._4_4_;
  auVar81._8_4_ = auVar53._8_4_ + auVar55._8_4_ * auVar194._0_4_ * fVar148 * auVar56._8_4_;
  auVar81._12_4_ = auVar53._12_4_ + auVar55._12_4_ * auVar194._0_4_ * fVar148 * auVar56._12_4_;
  auVar53 = vsubps_avx(auVar54,auVar81);
  auVar41 = vaddps_avx512vl(auVar35,auVar59);
  auVar56 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar240._0_4_ = auVar195._0_4_ * auVar56._0_4_;
  auVar240._4_4_ = auVar195._4_4_ * auVar56._4_4_;
  auVar240._8_4_ = auVar195._8_4_ * auVar56._8_4_;
  auVar240._12_4_ = auVar195._12_4_ * auVar56._12_4_;
  auVar54 = vsubps_avx512vl(auVar40,auVar240);
  auVar55 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar55 = vmulps_avx512vl(auVar55,auVar195);
  auVar83._0_4_ = auVar55._0_4_ + auVar56._0_4_ * fVar153 * auVar51._0_4_ * fVar152;
  auVar83._4_4_ = auVar55._4_4_ + auVar56._4_4_ * fVar153 * auVar51._4_4_ * fVar152;
  auVar83._8_4_ = auVar55._8_4_ + auVar56._8_4_ * fVar153 * auVar51._8_4_ * fVar152;
  auVar83._12_4_ = auVar55._12_4_ + auVar56._12_4_ * fVar153 * auVar51._12_4_ * fVar152;
  auVar51 = vsubps_avx(auVar57,auVar83);
  auVar35 = vaddps_avx512vl(auVar40,auVar240);
  auVar179._0_4_ = auVar42._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar42._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar42._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar42._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar154._0_4_ = auVar51._0_4_ * 0.33333334;
  auVar154._4_4_ = auVar51._4_4_ * 0.33333334;
  auVar154._8_4_ = auVar51._8_4_ * 0.33333334;
  auVar154._12_4_ = auVar51._12_4_ * 0.33333334;
  auVar59 = vsubps_avx(auVar54,auVar154);
  auVar78._0_4_ = (fVar139 + auVar81._0_4_) * 0.33333334;
  auVar78._4_4_ = (fVar145 + auVar81._4_4_) * 0.33333334;
  auVar78._8_4_ = (fVar146 + auVar81._8_4_) * 0.33333334;
  auVar78._12_4_ = (fVar147 + auVar81._12_4_) * 0.33333334;
  auVar37 = vaddps_avx512vl(auVar41,auVar78);
  auVar169._0_4_ = (fVar167 + auVar83._0_4_) * 0.33333334;
  auVar169._4_4_ = (fVar228 + auVar83._4_4_) * 0.33333334;
  auVar169._8_4_ = (fVar213 + auVar83._8_4_) * 0.33333334;
  auVar169._12_4_ = (fVar223 + auVar83._12_4_) * 0.33333334;
  auVar46 = vsubps_avx(auVar35,auVar169);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar1);
  auVar51 = vmulps_avx512vl(auVar47,auVar106._0_16_);
  auVar56 = vfmadd213ps_avx512vl(auVar68,auVar45,auVar51);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar44,auVar36);
  auVar38 = vfmadd231ps_avx512vl(auVar56,auVar43,auVar68);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar45,auVar60);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar44,auVar106._0_16_);
  auVar40 = vfnmadd231ps_avx512vl(auVar51,auVar43,auVar60);
  auVar51 = vmulps_avx512vl(auVar53,auVar106._0_16_);
  auVar56 = vfmadd213ps_avx512vl(auVar68,auVar71,auVar51);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar36);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar48,auVar68);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar60);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar49,auVar106._0_16_);
  auVar55 = vfnmadd231ps_avx512vl(auVar51,auVar48,auVar60);
  auVar51 = vmulps_avx512vl(auVar47,auVar68);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar45,auVar36);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar44,auVar68);
  auVar57 = vfmadd231ps_avx512vl(auVar51,auVar43,auVar106._0_16_);
  auVar51 = vmulps_avx512vl(auVar47,auVar60);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar106._0_16_,auVar45);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar60,auVar44);
  auVar43 = vfnmadd231ps_avx512vl(auVar51,auVar106._0_16_,auVar43);
  auVar51 = vmulps_avx512vl(auVar53,auVar68);
  auVar51 = vfmadd231ps_avx512vl(auVar51,auVar71,auVar36);
  auVar51 = vfmadd231ps_fma(auVar51,auVar49,auVar68);
  auVar44 = vfmadd231ps_avx512vl(auVar51,auVar48,auVar106._0_16_);
  auVar53 = vmulps_avx512vl(auVar53,auVar60);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar106._0_16_,auVar71);
  auVar53 = vfnmadd231ps_avx512vl(auVar53,auVar60,auVar49);
  auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar45 = vfnmadd231ps_avx512vl(auVar53,auVar106._0_16_,auVar48);
  auVar53 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar51 = vshufps_avx512vl(auVar56,auVar56,0xc9);
  fVar228 = auVar40._0_4_;
  auVar246._0_4_ = fVar228 * auVar51._0_4_;
  fVar213 = auVar40._4_4_;
  auVar246._4_4_ = fVar213 * auVar51._4_4_;
  fVar223 = auVar40._8_4_;
  auVar246._8_4_ = fVar223 * auVar51._8_4_;
  fVar148 = auVar40._12_4_;
  auVar246._12_4_ = fVar148 * auVar51._12_4_;
  auVar51 = vfmsub231ps_avx512vl(auVar246,auVar53,auVar56);
  auVar56 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar51 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar252._0_4_ = fVar228 * auVar51._0_4_;
  auVar252._4_4_ = fVar213 * auVar51._4_4_;
  auVar252._8_4_ = fVar223 * auVar51._8_4_;
  auVar252._12_4_ = fVar148 * auVar51._12_4_;
  auVar53 = vfmsub231ps_avx512vl(auVar252,auVar53,auVar55);
  auVar55 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar51 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar53 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar53 = vmulps_avx512vl(auVar43,auVar53);
  auVar53 = vfmsub231ps_avx512vl(auVar53,auVar51,auVar44);
  auVar44 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar47 = vshufps_avx512vl(auVar45,auVar45,0xc9);
  auVar53 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar47 = vmulps_avx512vl(auVar43,auVar47);
  auVar51 = vfmsub231ps_avx512vl(auVar47,auVar51,auVar45);
  auVar45 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar93._16_16_ = auVar106._16_16_;
  auVar93._0_16_ = auVar106._0_16_;
  auVar94._4_28_ = auVar93._4_28_;
  auVar94._0_4_ = auVar53._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar106._0_16_,auVar94._0_16_);
  auVar47 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar48 = vmulss_avx512f(auVar48,auVar51);
  auVar51 = vmulss_avx512f(auVar51,auVar51);
  auVar51 = vmulss_avx512f(auVar48,auVar51);
  auVar51 = vaddss_avx512f(auVar47,auVar51);
  auVar47 = vbroadcastss_avx512vl(auVar51);
  auVar48 = vmulps_avx512vl(auVar56,auVar47);
  auVar51 = vdpps_avx(auVar56,auVar55,0x7f);
  auVar49 = vbroadcastss_avx512vl(auVar53);
  auVar55 = vmulps_avx512vl(auVar49,auVar55);
  fVar153 = auVar51._0_4_;
  auVar79._0_4_ = auVar56._0_4_ * fVar153;
  auVar79._4_4_ = auVar56._4_4_ * fVar153;
  auVar79._8_4_ = auVar56._8_4_ * fVar153;
  auVar79._12_4_ = auVar56._12_4_ * fVar153;
  auVar51 = vsubps_avx(auVar55,auVar79);
  auVar56 = vrcp14ss_avx512f(auVar106._0_16_,auVar94._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar56,ZEXT416(0x40000000));
  fVar153 = auVar56._0_4_ * auVar53._0_4_;
  auVar53 = vdpps_avx(auVar44,auVar44,0x7f);
  auVar69._0_4_ = fVar153 * auVar51._0_4_;
  auVar69._4_4_ = fVar153 * auVar51._4_4_;
  auVar69._8_4_ = fVar153 * auVar51._8_4_;
  auVar69._12_4_ = fVar153 * auVar51._12_4_;
  auVar56 = vmulps_avx512vl(auVar47,auVar69);
  auVar95._16_16_ = auVar106._16_16_;
  auVar95._0_16_ = auVar106._0_16_;
  auVar96._4_28_ = auVar95._4_28_;
  auVar96._0_4_ = auVar53._0_4_;
  auVar51 = vrsqrt14ss_avx512f(auVar106._0_16_,auVar96._0_16_);
  auVar55 = vmulss_avx512f(auVar51,ZEXT416(0x3fc00000));
  auVar266 = ZEXT464(0x3f800000);
  auVar47 = vmulss_avx512f(auVar53,ZEXT416(0xbf000000));
  auVar47 = vmulss_avx512f(auVar47,auVar51);
  auVar51 = vmulss_avx512f(auVar47,ZEXT416((uint)(auVar51._0_4_ * auVar51._0_4_)));
  fVar153 = auVar55._0_4_ + auVar51._0_4_;
  auVar253._0_4_ = auVar44._0_4_ * fVar153;
  auVar253._4_4_ = auVar44._4_4_ * fVar153;
  auVar253._8_4_ = auVar44._8_4_ * fVar153;
  auVar253._12_4_ = auVar44._12_4_ * fVar153;
  auVar51 = vdpps_avx(auVar44,auVar45,0x7f);
  auVar55 = vbroadcastss_avx512vl(auVar53);
  auVar55 = vmulps_avx512vl(auVar55,auVar45);
  fVar167 = auVar51._0_4_;
  auVar170._0_4_ = auVar44._0_4_ * fVar167;
  auVar170._4_4_ = auVar44._4_4_ * fVar167;
  auVar170._8_4_ = auVar44._8_4_ * fVar167;
  auVar170._12_4_ = auVar44._12_4_ * fVar167;
  auVar51 = vsubps_avx(auVar55,auVar170);
  auVar55 = vrcp14ss_avx512f(auVar106._0_16_,auVar96._0_16_);
  auVar53 = vfnmadd213ss_avx512f(auVar53,auVar55,ZEXT416(0x40000000));
  fVar167 = auVar53._0_4_ * auVar55._0_4_;
  auVar55 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar44 = vmulps_avx512vl(auVar55,auVar48);
  auVar45 = vsubps_avx512vl(auVar38,auVar44);
  auVar53 = vshufps_avx(auVar40,auVar40,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar48);
  auVar70._0_4_ = auVar53._0_4_ + auVar55._0_4_ * auVar56._0_4_;
  auVar70._4_4_ = auVar53._4_4_ + auVar55._4_4_ * auVar56._4_4_;
  auVar70._8_4_ = auVar53._8_4_ + auVar55._8_4_ * auVar56._8_4_;
  auVar70._12_4_ = auVar53._12_4_ + auVar55._12_4_ * auVar56._12_4_;
  auVar53 = vsubps_avx(auVar40,auVar70);
  auVar56 = vaddps_avx512vl(auVar38,auVar44);
  auVar55 = vshufps_avx512vl(auVar57,auVar57,0xff);
  auVar230._0_4_ = auVar55._0_4_ * auVar253._0_4_;
  auVar230._4_4_ = auVar55._4_4_ * auVar253._4_4_;
  auVar230._8_4_ = auVar55._8_4_ * auVar253._8_4_;
  auVar230._12_4_ = auVar55._12_4_ * auVar253._12_4_;
  auVar44 = vsubps_avx512vl(auVar57,auVar230);
  auVar47 = vshufps_avx512vl(auVar43,auVar43,0xff);
  auVar47 = vmulps_avx512vl(auVar47,auVar253);
  auVar86._0_4_ = auVar47._0_4_ + auVar55._0_4_ * fVar153 * auVar51._0_4_ * fVar167;
  auVar86._4_4_ = auVar47._4_4_ + auVar55._4_4_ * fVar153 * auVar51._4_4_ * fVar167;
  auVar86._8_4_ = auVar47._8_4_ + auVar55._8_4_ * fVar153 * auVar51._8_4_ * fVar167;
  auVar86._12_4_ = auVar47._12_4_ + auVar55._12_4_ * fVar153 * auVar51._12_4_ * fVar167;
  auVar51 = vsubps_avx(auVar43,auVar86);
  auVar55 = vaddps_avx512vl(auVar57,auVar230);
  auVar171._0_4_ = auVar45._0_4_ + auVar53._0_4_ * 0.33333334;
  auVar171._4_4_ = auVar45._4_4_ + auVar53._4_4_ * 0.33333334;
  auVar171._8_4_ = auVar45._8_4_ + auVar53._8_4_ * 0.33333334;
  auVar171._12_4_ = auVar45._12_4_ + auVar53._12_4_ * 0.33333334;
  auVar196._0_4_ = auVar51._0_4_ * 0.33333334;
  auVar196._4_4_ = auVar51._4_4_ * 0.33333334;
  auVar196._8_4_ = auVar51._8_4_ * 0.33333334;
  auVar196._12_4_ = auVar51._12_4_ * 0.33333334;
  auVar53 = vsubps_avx(auVar44,auVar196);
  auVar72._0_4_ = auVar56._0_4_ + (fVar228 + auVar70._0_4_) * 0.33333334;
  auVar72._4_4_ = auVar56._4_4_ + (fVar213 + auVar70._4_4_) * 0.33333334;
  auVar72._8_4_ = auVar56._8_4_ + (fVar223 + auVar70._8_4_) * 0.33333334;
  auVar72._12_4_ = auVar56._12_4_ + (fVar148 + auVar70._12_4_) * 0.33333334;
  auVar87._0_4_ = (auVar43._0_4_ + auVar86._0_4_) * 0.33333334;
  auVar87._4_4_ = (auVar43._4_4_ + auVar86._4_4_) * 0.33333334;
  auVar87._8_4_ = (auVar43._8_4_ + auVar86._8_4_) * 0.33333334;
  auVar87._12_4_ = (auVar43._12_4_ + auVar86._12_4_) * 0.33333334;
  auVar51 = vsubps_avx(auVar55,auVar87);
  auVar241._4_4_ = fVar224;
  auVar241._0_4_ = fVar224;
  auVar241._8_4_ = fVar224;
  auVar241._12_4_ = fVar224;
  auVar43 = vsubss_avx512f(ZEXT416(0x3f800000),ZEXT416((uint)fVar224));
  auVar254._0_4_ = auVar43._0_4_;
  auVar254._4_4_ = auVar254._0_4_;
  auVar254._8_4_ = auVar254._0_4_;
  auVar254._12_4_ = auVar254._0_4_;
  auVar43 = vmulps_avx512vl(auVar241,auVar45);
  auVar45 = vmulps_avx512vl(auVar241,auVar171);
  auVar53 = vmulps_avx512vl(auVar241,auVar53);
  auVar247._0_4_ = fVar224 * auVar44._0_4_;
  auVar247._4_4_ = fVar224 * auVar44._4_4_;
  auVar247._8_4_ = fVar224 * auVar44._8_4_;
  auVar247._12_4_ = fVar224 * auVar44._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar43,auVar254,auVar42);
  auVar57 = vfmadd231ps_avx512vl(auVar45,auVar254,auVar179);
  auVar60 = vfmadd231ps_avx512vl(auVar53,auVar254,auVar59);
  auVar44 = vfmadd231ps_fma(auVar247,auVar254,auVar54);
  auVar53 = vmulps_avx512vl(auVar241,auVar56);
  auVar56 = vmulps_avx512vl(auVar241,auVar72);
  auVar51 = vmulps_avx512vl(auVar241,auVar51);
  auVar242._0_4_ = fVar224 * auVar55._0_4_;
  auVar242._4_4_ = fVar224 * auVar55._4_4_;
  auVar242._8_4_ = fVar224 * auVar55._8_4_;
  auVar242._12_4_ = fVar224 * auVar55._12_4_;
  auVar61 = vfmadd231ps_avx512vl(auVar53,auVar254,auVar41);
  auVar62 = vfmadd231ps_avx512vl(auVar56,auVar254,auVar37);
  auVar63 = vfmadd231ps_avx512vl(auVar51,auVar254,auVar46);
  auVar45 = vfmadd231ps_fma(auVar242,auVar254,auVar35);
  auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar64 = vsubps_avx512vl(auVar40,auVar53);
  uVar125 = auVar64._0_4_;
  auVar73._4_4_ = uVar125;
  auVar73._0_4_ = uVar125;
  auVar73._8_4_ = uVar125;
  auVar73._12_4_ = uVar125;
  auVar51 = vshufps_avx(auVar64,auVar64,0x55);
  auVar56 = vshufps_avx(auVar64,auVar64,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar153 = pre->ray_space[k].vz.field_0.m128[0];
  fVar167 = pre->ray_space[k].vz.field_0.m128[1];
  fVar228 = pre->ray_space[k].vz.field_0.m128[2];
  fVar213 = pre->ray_space[k].vz.field_0.m128[3];
  auVar67._0_4_ = fVar153 * auVar56._0_4_;
  auVar67._4_4_ = fVar167 * auVar56._4_4_;
  auVar67._8_4_ = fVar228 * auVar56._8_4_;
  auVar67._12_4_ = fVar213 * auVar56._12_4_;
  auVar51 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar4,auVar51);
  auVar47 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar73);
  auVar65 = vsubps_avx512vl(auVar57,auVar53);
  uVar125 = auVar65._0_4_;
  auVar74._4_4_ = uVar125;
  auVar74._0_4_ = uVar125;
  auVar74._8_4_ = uVar125;
  auVar74._12_4_ = uVar125;
  auVar51 = vshufps_avx(auVar65,auVar65,0x55);
  auVar56 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar89._0_4_ = fVar153 * auVar56._0_4_;
  auVar89._4_4_ = fVar167 * auVar56._4_4_;
  auVar89._8_4_ = fVar228 * auVar56._8_4_;
  auVar89._12_4_ = fVar213 * auVar56._12_4_;
  auVar51 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar51);
  auVar48 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar74);
  auVar66 = vsubps_avx512vl(auVar60,auVar53);
  uVar125 = auVar66._0_4_;
  auVar75._4_4_ = uVar125;
  auVar75._0_4_ = uVar125;
  auVar75._8_4_ = uVar125;
  auVar75._12_4_ = uVar125;
  auVar51 = vshufps_avx(auVar66,auVar66,0x55);
  auVar56 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar186._0_4_ = auVar56._0_4_ * fVar153;
  auVar186._4_4_ = auVar56._4_4_ * fVar167;
  auVar186._8_4_ = auVar56._8_4_ * fVar228;
  auVar186._12_4_ = auVar56._12_4_ * fVar213;
  auVar51 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar4,auVar51);
  auVar49 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar75);
  auVar41 = vsubps_avx(auVar44,auVar53);
  uVar125 = auVar41._0_4_;
  auVar77._4_4_ = uVar125;
  auVar77._0_4_ = uVar125;
  auVar77._8_4_ = uVar125;
  auVar77._12_4_ = uVar125;
  auVar51 = vshufps_avx(auVar41,auVar41,0x55);
  auVar56 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar197._0_4_ = auVar56._0_4_ * fVar153;
  auVar197._4_4_ = auVar56._4_4_ * fVar167;
  auVar197._8_4_ = auVar56._8_4_ * fVar228;
  auVar197._12_4_ = auVar56._12_4_ * fVar213;
  auVar51 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar4,auVar51);
  auVar71 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar77);
  auVar67 = vsubps_avx512vl(auVar61,auVar53);
  uVar125 = auVar67._0_4_;
  auVar88._4_4_ = uVar125;
  auVar88._0_4_ = uVar125;
  auVar88._8_4_ = uVar125;
  auVar88._12_4_ = uVar125;
  auVar51 = vshufps_avx(auVar67,auVar67,0x55);
  auVar56 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar208._0_4_ = auVar56._0_4_ * fVar153;
  auVar208._4_4_ = auVar56._4_4_ * fVar167;
  auVar208._8_4_ = auVar56._8_4_ * fVar228;
  auVar208._12_4_ = auVar56._12_4_ * fVar213;
  auVar51 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar4,auVar51);
  auVar54 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar88);
  auVar68 = vsubps_avx512vl(auVar62,auVar53);
  uVar125 = auVar68._0_4_;
  auVar85._4_4_ = uVar125;
  auVar85._0_4_ = uVar125;
  auVar85._8_4_ = uVar125;
  auVar85._12_4_ = uVar125;
  auVar51 = vshufps_avx(auVar68,auVar68,0x55);
  auVar56 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar214._0_4_ = auVar56._0_4_ * fVar153;
  auVar214._4_4_ = auVar56._4_4_ * fVar167;
  auVar214._8_4_ = auVar56._8_4_ * fVar228;
  auVar214._12_4_ = auVar56._12_4_ * fVar213;
  auVar51 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar4,auVar51);
  auVar35 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar85);
  auVar69 = vsubps_avx512vl(auVar63,auVar53);
  uVar125 = auVar69._0_4_;
  auVar80._4_4_ = uVar125;
  auVar80._0_4_ = uVar125;
  auVar80._8_4_ = uVar125;
  auVar80._12_4_ = uVar125;
  auVar51 = vshufps_avx(auVar69,auVar69,0x55);
  auVar56 = vshufps_avx(auVar69,auVar69,0xaa);
  auVar231._0_4_ = auVar56._0_4_ * fVar153;
  auVar231._4_4_ = auVar56._4_4_ * fVar167;
  auVar231._8_4_ = auVar56._8_4_ * fVar228;
  auVar231._12_4_ = auVar56._12_4_ * fVar213;
  auVar51 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar4,auVar51);
  auVar36 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar3,auVar80);
  auVar42 = vsubps_avx(auVar45,auVar53);
  uVar125 = auVar42._0_4_;
  auVar76._4_4_ = uVar125;
  auVar76._0_4_ = uVar125;
  auVar76._8_4_ = uVar125;
  auVar76._12_4_ = uVar125;
  auVar53 = vshufps_avx(auVar42,auVar42,0x55);
  auVar51 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar172._0_4_ = fVar153 * auVar51._0_4_;
  auVar172._4_4_ = fVar167 * auVar51._4_4_;
  auVar172._8_4_ = fVar228 * auVar51._8_4_;
  auVar172._12_4_ = fVar213 * auVar51._12_4_;
  auVar53 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar4,auVar53);
  auVar38 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar3,auVar76);
  auVar56 = vmovlhps_avx(auVar47,auVar54);
  auVar55 = vmovlhps_avx(auVar48,auVar35);
  auVar59 = vmovlhps_avx(auVar49,auVar36);
  auVar43 = vmovlhps_avx512f(auVar71,auVar38);
  auVar51 = vminps_avx(auVar56,auVar55);
  auVar53 = vmaxps_avx(auVar56,auVar55);
  auVar46 = vminps_avx512vl(auVar59,auVar43);
  auVar51 = vminps_avx(auVar51,auVar46);
  auVar46 = vmaxps_avx512vl(auVar59,auVar43);
  auVar53 = vmaxps_avx(auVar53,auVar46);
  auVar46 = vshufpd_avx(auVar51,auVar51,3);
  auVar51 = vminps_avx(auVar51,auVar46);
  auVar46 = vshufpd_avx(auVar53,auVar53,3);
  auVar53 = vmaxps_avx(auVar53,auVar46);
  auVar51 = vandps_avx512vl(auVar51,auVar264._0_16_);
  auVar53 = vandps_avx512vl(auVar53,auVar264._0_16_);
  auVar53 = vmaxps_avx(auVar51,auVar53);
  auVar51 = vmovshdup_avx(auVar53);
  auVar53 = vmaxss_avx(auVar51,auVar53);
  lVar25 = uVar27 + 0xf;
  fVar167 = auVar53._0_4_ * 9.536743e-07;
  auVar70 = vmovddup_avx512vl(auVar47);
  auVar48 = vmovddup_avx512vl(auVar48);
  auVar187._0_8_ = auVar49._0_8_;
  auVar187._8_8_ = auVar187._0_8_;
  auVar198._0_8_ = auVar71._0_8_;
  auVar198._8_8_ = auVar198._0_8_;
  auVar130._4_4_ = fVar167;
  auVar130._0_4_ = fVar167;
  auVar130._8_4_ = fVar167;
  auVar130._12_4_ = fVar167;
  auVar132._16_4_ = fVar167;
  auVar132._0_16_ = auVar130;
  auVar132._20_4_ = fVar167;
  auVar132._24_4_ = fVar167;
  auVar132._28_4_ = fVar167;
  auVar53 = vxorps_avx512vl(auVar130,auVar58);
  local_78 = auVar53._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  bVar29 = false;
  uVar22 = 0;
  fVar153 = *(float *)(ray + k * 4 + 0x30);
  auVar53 = vsubps_avx(auVar55,auVar56);
  auVar51 = vsubps_avx(auVar59,auVar55);
  auVar49 = vsubps_avx512vl(auVar43,auVar59);
  auVar71 = vsubps_avx512vl(auVar61,auVar40);
  auVar58 = vsubps_avx512vl(auVar62,auVar57);
  auVar72 = vsubps_avx512vl(auVar63,auVar60);
  auVar46 = vsubps_avx(auVar45,auVar44);
  auVar73 = vpbroadcastd_avx512vl();
  auVar47 = ZEXT816(0x3f80000000000000);
  auVar37 = auVar47;
LAB_018f7b4b:
  auVar89 = vshufps_avx(auVar37,auVar37,0x50);
  auVar248._8_4_ = 0x3f800000;
  auVar248._0_8_ = 0x3f8000003f800000;
  auVar248._12_4_ = 0x3f800000;
  auVar251._16_4_ = 0x3f800000;
  auVar251._0_16_ = auVar248;
  auVar251._20_4_ = 0x3f800000;
  auVar251._24_4_ = 0x3f800000;
  auVar251._28_4_ = 0x3f800000;
  auVar130 = vsubps_avx(auVar248,auVar89);
  fVar228 = auVar89._0_4_;
  fVar148 = auVar54._0_4_;
  auVar149._0_4_ = fVar148 * fVar228;
  fVar213 = auVar89._4_4_;
  fVar152 = auVar54._4_4_;
  auVar149._4_4_ = fVar152 * fVar213;
  fVar223 = auVar89._8_4_;
  auVar149._8_4_ = fVar148 * fVar223;
  fVar224 = auVar89._12_4_;
  auVar149._12_4_ = fVar152 * fVar224;
  fVar139 = auVar35._0_4_;
  auVar155._0_4_ = fVar139 * fVar228;
  fVar145 = auVar35._4_4_;
  auVar155._4_4_ = fVar145 * fVar213;
  auVar155._8_4_ = fVar139 * fVar223;
  auVar155._12_4_ = fVar145 * fVar224;
  fVar146 = auVar36._0_4_;
  auVar173._0_4_ = fVar146 * fVar228;
  fVar147 = auVar36._4_4_;
  auVar173._4_4_ = fVar147 * fVar213;
  auVar173._8_4_ = fVar146 * fVar223;
  auVar173._12_4_ = fVar147 * fVar224;
  fVar229 = auVar38._0_4_;
  auVar133._0_4_ = fVar229 * fVar228;
  fVar239 = auVar38._4_4_;
  auVar133._4_4_ = fVar239 * fVar213;
  auVar133._8_4_ = fVar229 * fVar223;
  auVar133._12_4_ = fVar239 * fVar224;
  auVar74 = vfmadd231ps_avx512vl(auVar149,auVar130,auVar70);
  auVar75 = vfmadd231ps_avx512vl(auVar155,auVar130,auVar48);
  auVar76 = vfmadd231ps_fma(auVar173,auVar130,auVar187);
  auVar130 = vfmadd231ps_fma(auVar133,auVar198,auVar130);
  auVar89 = vmovshdup_avx(auVar47);
  fVar213 = auVar47._0_4_;
  fVar228 = (auVar89._0_4_ - fVar213) * 0.04761905;
  auVar161._4_4_ = fVar213;
  auVar161._0_4_ = fVar213;
  auVar161._8_4_ = fVar213;
  auVar161._12_4_ = fVar213;
  auVar161._16_4_ = fVar213;
  auVar161._20_4_ = fVar213;
  auVar161._24_4_ = fVar213;
  auVar161._28_4_ = fVar213;
  auVar101._0_8_ = auVar89._0_8_;
  auVar101._8_8_ = auVar101._0_8_;
  auVar101._16_8_ = auVar101._0_8_;
  auVar101._24_8_ = auVar101._0_8_;
  auVar110 = vsubps_avx(auVar101,auVar161);
  uVar125 = auVar74._0_4_;
  auVar144._4_4_ = uVar125;
  auVar144._0_4_ = uVar125;
  auVar144._8_4_ = uVar125;
  auVar144._12_4_ = uVar125;
  auVar144._16_4_ = uVar125;
  auVar144._20_4_ = uVar125;
  auVar144._24_4_ = uVar125;
  auVar144._28_4_ = uVar125;
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  auVar109 = ZEXT1632(auVar74);
  auVar106 = vpermps_avx2(auVar102,auVar109);
  auVar91 = vbroadcastss_avx512vl(auVar75);
  auVar107 = ZEXT1632(auVar75);
  auVar92 = vpermps_avx512vl(auVar102,auVar107);
  auVar93 = vbroadcastss_avx512vl(auVar76);
  auVar108 = ZEXT1632(auVar76);
  auVar94 = vpermps_avx512vl(auVar102,auVar108);
  auVar95 = vbroadcastss_avx512vl(auVar130);
  auVar105 = ZEXT1632(auVar130);
  auVar96 = vpermps_avx512vl(auVar102,auVar105);
  auVar211._4_4_ = fVar228;
  auVar211._0_4_ = fVar228;
  auVar211._8_4_ = fVar228;
  auVar211._12_4_ = fVar228;
  auVar211._16_4_ = fVar228;
  auVar211._20_4_ = fVar228;
  auVar211._24_4_ = fVar228;
  auVar211._28_4_ = fVar228;
  auVar103._8_4_ = 2;
  auVar103._0_8_ = 0x200000002;
  auVar103._12_4_ = 2;
  auVar103._16_4_ = 2;
  auVar103._20_4_ = 2;
  auVar103._24_4_ = 2;
  auVar103._28_4_ = 2;
  auVar97 = vpermps_avx512vl(auVar103,auVar109);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar99 = vpermps_avx512vl(auVar98,auVar109);
  auVar100 = vpermps_avx512vl(auVar103,auVar107);
  auVar101 = vpermps_avx512vl(auVar98,auVar107);
  auVar109 = vpermps_avx2(auVar103,auVar108);
  auVar102 = vpermps_avx512vl(auVar98,auVar108);
  auVar103 = vpermps_avx512vl(auVar103,auVar105);
  auVar104 = vpermps_avx512vl(auVar98,auVar105);
  auVar89 = vfmadd132ps_fma(auVar110,auVar161,_DAT_01f7b040);
  auVar110 = vsubps_avx(auVar251,ZEXT1632(auVar89));
  auVar98 = vmulps_avx512vl(auVar91,ZEXT1632(auVar89));
  auVar107 = ZEXT1632(auVar89);
  auVar105 = vmulps_avx512vl(auVar92,auVar107);
  auVar130 = vfmadd231ps_fma(auVar98,auVar110,auVar144);
  auVar76 = vfmadd231ps_fma(auVar105,auVar110,auVar106);
  auVar98 = vmulps_avx512vl(auVar93,auVar107);
  auVar105 = vmulps_avx512vl(auVar94,auVar107);
  auVar91 = vfmadd231ps_avx512vl(auVar98,auVar110,auVar91);
  auVar92 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar92);
  auVar98 = vmulps_avx512vl(auVar95,auVar107);
  auVar144 = ZEXT1632(auVar89);
  auVar96 = vmulps_avx512vl(auVar96,auVar144);
  auVar93 = vfmadd231ps_avx512vl(auVar98,auVar110,auVar93);
  auVar94 = vfmadd231ps_avx512vl(auVar96,auVar110,auVar94);
  fVar223 = auVar89._0_4_;
  fVar224 = auVar89._4_4_;
  auVar98._4_4_ = fVar224 * auVar91._4_4_;
  auVar98._0_4_ = fVar223 * auVar91._0_4_;
  fVar225 = auVar89._8_4_;
  auVar98._8_4_ = fVar225 * auVar91._8_4_;
  fVar226 = auVar89._12_4_;
  auVar98._12_4_ = fVar226 * auVar91._12_4_;
  auVar98._16_4_ = auVar91._16_4_ * 0.0;
  auVar98._20_4_ = auVar91._20_4_ * 0.0;
  auVar98._24_4_ = auVar91._24_4_ * 0.0;
  auVar98._28_4_ = fVar213;
  auVar105._4_4_ = fVar224 * auVar92._4_4_;
  auVar105._0_4_ = fVar223 * auVar92._0_4_;
  auVar105._8_4_ = fVar225 * auVar92._8_4_;
  auVar105._12_4_ = fVar226 * auVar92._12_4_;
  auVar105._16_4_ = auVar92._16_4_ * 0.0;
  auVar105._20_4_ = auVar92._20_4_ * 0.0;
  auVar105._24_4_ = auVar92._24_4_ * 0.0;
  auVar105._28_4_ = auVar106._28_4_;
  auVar130 = vfmadd231ps_fma(auVar98,auVar110,ZEXT1632(auVar130));
  auVar76 = vfmadd231ps_fma(auVar105,auVar110,ZEXT1632(auVar76));
  auVar111._0_4_ = fVar223 * auVar93._0_4_;
  auVar111._4_4_ = fVar224 * auVar93._4_4_;
  auVar111._8_4_ = fVar225 * auVar93._8_4_;
  auVar111._12_4_ = fVar226 * auVar93._12_4_;
  auVar111._16_4_ = auVar93._16_4_ * 0.0;
  auVar111._20_4_ = auVar93._20_4_ * 0.0;
  auVar111._24_4_ = auVar93._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar107._4_4_ = fVar224 * auVar94._4_4_;
  auVar107._0_4_ = fVar223 * auVar94._0_4_;
  auVar107._8_4_ = fVar225 * auVar94._8_4_;
  auVar107._12_4_ = fVar226 * auVar94._12_4_;
  auVar107._16_4_ = auVar94._16_4_ * 0.0;
  auVar107._20_4_ = auVar94._20_4_ * 0.0;
  auVar107._24_4_ = auVar94._24_4_ * 0.0;
  auVar107._28_4_ = auVar93._28_4_;
  auVar74 = vfmadd231ps_fma(auVar111,auVar110,auVar91);
  auVar75 = vfmadd231ps_fma(auVar107,auVar110,auVar92);
  auVar108._28_4_ = auVar92._28_4_;
  auVar108._0_28_ =
       ZEXT1628(CONCAT412(fVar226 * auVar75._12_4_,
                          CONCAT48(fVar225 * auVar75._8_4_,
                                   CONCAT44(fVar224 * auVar75._4_4_,fVar223 * auVar75._0_4_))));
  auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar226 * auVar74._12_4_,
                                               CONCAT48(fVar225 * auVar74._8_4_,
                                                        CONCAT44(fVar224 * auVar74._4_4_,
                                                                 fVar223 * auVar74._0_4_)))),
                            auVar110,ZEXT1632(auVar130));
  auVar88 = vfmadd231ps_fma(auVar108,auVar110,ZEXT1632(auVar76));
  auVar106 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar130));
  auVar91 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar76));
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar106 = vmulps_avx512vl(auVar106,auVar92);
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  auVar207._0_4_ = fVar228 * auVar106._0_4_;
  auVar207._4_4_ = fVar228 * auVar106._4_4_;
  auVar207._8_4_ = fVar228 * auVar106._8_4_;
  auVar207._12_4_ = fVar228 * auVar106._12_4_;
  auVar207._16_4_ = fVar228 * auVar106._16_4_;
  auVar207._20_4_ = fVar228 * auVar106._20_4_;
  auVar207._24_4_ = fVar228 * auVar106._24_4_;
  auVar207._28_4_ = 0;
  auVar106 = vmulps_avx512vl(auVar211,auVar91);
  auVar76 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
  auVar91 = vpermt2ps_avx512vl(ZEXT1632(auVar77),_DAT_01fb9fc0,ZEXT1632(auVar76));
  auVar93 = vpermt2ps_avx512vl(ZEXT1632(auVar88),_DAT_01fb9fc0,ZEXT1632(auVar76));
  auVar138._0_4_ = auVar207._0_4_ + auVar77._0_4_;
  auVar138._4_4_ = auVar207._4_4_ + auVar77._4_4_;
  auVar138._8_4_ = auVar207._8_4_ + auVar77._8_4_;
  auVar138._12_4_ = auVar207._12_4_ + auVar77._12_4_;
  auVar138._16_4_ = auVar207._16_4_ + 0.0;
  auVar138._20_4_ = auVar207._20_4_ + 0.0;
  auVar138._24_4_ = auVar207._24_4_ + 0.0;
  auVar138._28_4_ = 0;
  auVar111 = ZEXT1632(auVar76);
  auVar94 = vpermt2ps_avx512vl(auVar207,_DAT_01fb9fc0,auVar111);
  auVar95 = vaddps_avx512vl(ZEXT1632(auVar88),auVar106);
  auVar96 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar111);
  auVar106 = vsubps_avx(auVar91,auVar94);
  auVar94 = vsubps_avx512vl(auVar93,auVar96);
  auVar96 = vmulps_avx512vl(auVar100,auVar144);
  auVar98 = vmulps_avx512vl(auVar101,auVar144);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar110,auVar97);
  auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,auVar99);
  auVar105 = vmulps_avx512vl(auVar109,auVar144);
  auVar107 = vmulps_avx512vl(auVar102,auVar144);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar100);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,auVar101);
  auVar108 = vmulps_avx512vl(auVar103,auVar144);
  auVar97 = vmulps_avx512vl(auVar104,auVar144);
  auVar130 = vfmadd231ps_fma(auVar108,auVar110,auVar109);
  auVar109 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar102);
  auVar108 = vmulps_avx512vl(auVar144,auVar105);
  auVar99 = ZEXT1632(auVar89);
  auVar97 = vmulps_avx512vl(auVar99,auVar107);
  auVar96 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar96);
  auVar98 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar98);
  auVar109 = vmulps_avx512vl(auVar99,auVar109);
  auVar105 = vfmadd231ps_avx512vl
                       (ZEXT1632(CONCAT412(fVar226 * auVar130._12_4_,
                                           CONCAT48(fVar225 * auVar130._8_4_,
                                                    CONCAT44(fVar224 * auVar130._4_4_,
                                                             fVar223 * auVar130._0_4_)))),auVar110,
                        auVar105);
  auVar109 = vfmadd231ps_avx512vl(auVar109,auVar110,auVar107);
  auVar97._4_4_ = fVar224 * auVar105._4_4_;
  auVar97._0_4_ = fVar223 * auVar105._0_4_;
  auVar97._8_4_ = fVar225 * auVar105._8_4_;
  auVar97._12_4_ = fVar226 * auVar105._12_4_;
  auVar97._16_4_ = auVar105._16_4_ * 0.0;
  auVar97._20_4_ = auVar105._20_4_ * 0.0;
  auVar97._24_4_ = auVar105._24_4_ * 0.0;
  auVar97._28_4_ = auVar102._28_4_;
  auVar107 = vmulps_avx512vl(auVar99,auVar109);
  auVar108 = vfmadd231ps_avx512vl(auVar97,auVar110,auVar96);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar98,auVar110);
  auVar110 = vsubps_avx512vl(auVar105,auVar96);
  auVar109 = vsubps_avx512vl(auVar109,auVar98);
  auVar110 = vmulps_avx512vl(auVar110,auVar92);
  auVar109 = vmulps_avx512vl(auVar109,auVar92);
  fVar213 = fVar228 * auVar110._0_4_;
  fVar223 = fVar228 * auVar110._4_4_;
  auVar99._4_4_ = fVar223;
  auVar99._0_4_ = fVar213;
  fVar224 = fVar228 * auVar110._8_4_;
  auVar99._8_4_ = fVar224;
  fVar225 = fVar228 * auVar110._12_4_;
  auVar99._12_4_ = fVar225;
  fVar226 = fVar228 * auVar110._16_4_;
  auVar99._16_4_ = fVar226;
  fVar227 = fVar228 * auVar110._20_4_;
  auVar99._20_4_ = fVar227;
  fVar228 = fVar228 * auVar110._24_4_;
  auVar99._24_4_ = fVar228;
  auVar99._28_4_ = auVar110._28_4_;
  auVar109 = vmulps_avx512vl(auVar211,auVar109);
  auVar92 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar111);
  auVar96 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar111);
  auVar212._0_4_ = auVar108._0_4_ + fVar213;
  auVar212._4_4_ = auVar108._4_4_ + fVar223;
  auVar212._8_4_ = auVar108._8_4_ + fVar224;
  auVar212._12_4_ = auVar108._12_4_ + fVar225;
  auVar212._16_4_ = auVar108._16_4_ + fVar226;
  auVar212._20_4_ = auVar108._20_4_ + fVar227;
  auVar212._24_4_ = auVar108._24_4_ + fVar228;
  auVar212._28_4_ = auVar108._28_4_ + auVar110._28_4_;
  auVar110 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar76));
  auVar98 = vaddps_avx512vl(auVar107,auVar109);
  auVar109 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,ZEXT1632(auVar76));
  auVar110 = vsubps_avx(auVar92,auVar110);
  auVar109 = vsubps_avx512vl(auVar96,auVar109);
  auVar144 = ZEXT1632(auVar77);
  auVar105 = vsubps_avx512vl(auVar108,auVar144);
  auVar161 = ZEXT1632(auVar88);
  auVar97 = vsubps_avx512vl(auVar107,auVar161);
  auVar99 = vsubps_avx512vl(auVar92,auVar91);
  auVar105 = vaddps_avx512vl(auVar105,auVar99);
  auVar99 = vsubps_avx512vl(auVar96,auVar93);
  auVar97 = vaddps_avx512vl(auVar97,auVar99);
  auVar99 = vmulps_avx512vl(auVar161,auVar105);
  auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar144,auVar97);
  auVar100 = vmulps_avx512vl(auVar95,auVar105);
  auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar138,auVar97);
  auVar101 = vmulps_avx512vl(auVar94,auVar105);
  auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar106,auVar97);
  auVar102 = vmulps_avx512vl(auVar93,auVar105);
  auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar91,auVar97);
  auVar103 = vmulps_avx512vl(auVar107,auVar105);
  auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar108,auVar97);
  auVar104 = vmulps_avx512vl(auVar98,auVar105);
  auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar212,auVar97);
  auVar111 = vmulps_avx512vl(auVar109,auVar105);
  auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar110,auVar97);
  auVar105 = vmulps_avx512vl(auVar96,auVar105);
  auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar92,auVar97);
  auVar97 = vminps_avx512vl(auVar99,auVar100);
  auVar99 = vmaxps_avx512vl(auVar99,auVar100);
  auVar100 = vminps_avx512vl(auVar101,auVar102);
  auVar97 = vminps_avx512vl(auVar97,auVar100);
  auVar100 = vmaxps_avx512vl(auVar101,auVar102);
  auVar99 = vmaxps_avx512vl(auVar99,auVar100);
  auVar100 = vminps_avx512vl(auVar103,auVar104);
  auVar101 = vmaxps_avx512vl(auVar103,auVar104);
  auVar102 = vminps_avx512vl(auVar111,auVar105);
  auVar100 = vminps_avx512vl(auVar100,auVar102);
  auVar97 = vminps_avx512vl(auVar97,auVar100);
  auVar105 = vmaxps_avx512vl(auVar111,auVar105);
  auVar105 = vmaxps_avx512vl(auVar101,auVar105);
  auVar105 = vmaxps_avx512vl(auVar99,auVar105);
  auVar89 = auVar105._0_16_;
  uVar13 = vcmpps_avx512vl(auVar97,auVar132,2);
  auVar100._4_4_ = uStack_74;
  auVar100._0_4_ = local_78;
  auVar100._8_4_ = uStack_70;
  auVar100._12_4_ = uStack_6c;
  auVar100._16_4_ = uStack_68;
  auVar100._20_4_ = uStack_64;
  auVar100._24_4_ = uStack_60;
  auVar100._28_4_ = uStack_5c;
  uVar14 = vcmpps_avx512vl(auVar105,auVar100,5);
  bVar20 = (byte)uVar13 & (byte)uVar14 & 0x7f;
  if (bVar20 != 0) {
    auVar105 = vsubps_avx512vl(auVar91,auVar144);
    auVar97 = vsubps_avx512vl(auVar93,auVar161);
    auVar99 = vsubps_avx512vl(auVar92,auVar108);
    auVar105 = vaddps_avx512vl(auVar105,auVar99);
    auVar89 = auVar105._0_16_;
    auVar99 = vsubps_avx512vl(auVar96,auVar107);
    auVar97 = vaddps_avx512vl(auVar97,auVar99);
    auVar99 = vmulps_avx512vl(auVar161,auVar105);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar97,auVar144);
    auVar95 = vmulps_avx512vl(auVar95,auVar105);
    auVar95 = vfnmadd213ps_avx512vl(auVar138,auVar97,auVar95);
    auVar94 = vmulps_avx512vl(auVar94,auVar105);
    auVar94 = vfnmadd213ps_avx512vl(auVar106,auVar97,auVar94);
    auVar106 = vmulps_avx512vl(auVar93,auVar105);
    auVar93 = vfnmadd231ps_avx512vl(auVar106,auVar97,auVar91);
    auVar106 = vmulps_avx512vl(auVar107,auVar105);
    auVar107 = vfnmadd231ps_avx512vl(auVar106,auVar97,auVar108);
    auVar106 = vmulps_avx512vl(auVar98,auVar105);
    auVar98 = vfnmadd213ps_avx512vl(auVar212,auVar97,auVar106);
    auVar106 = vmulps_avx512vl(auVar109,auVar105);
    auVar108 = vfnmadd213ps_avx512vl(auVar110,auVar97,auVar106);
    auVar110 = vmulps_avx512vl(auVar96,auVar105);
    auVar96 = vfnmadd231ps_avx512vl(auVar110,auVar92,auVar97);
    auVar106 = vminps_avx(auVar99,auVar95);
    auVar110 = vmaxps_avx(auVar99,auVar95);
    auVar91 = vminps_avx(auVar94,auVar93);
    auVar91 = vminps_avx(auVar106,auVar91);
    auVar106 = vmaxps_avx(auVar94,auVar93);
    auVar110 = vmaxps_avx(auVar110,auVar106);
    auVar109 = vminps_avx(auVar107,auVar98);
    auVar106 = vmaxps_avx(auVar107,auVar98);
    auVar92 = vminps_avx(auVar108,auVar96);
    auVar109 = vminps_avx(auVar109,auVar92);
    auVar109 = vminps_avx(auVar91,auVar109);
    auVar91 = vmaxps_avx(auVar108,auVar96);
    auVar106 = vmaxps_avx(auVar106,auVar91);
    auVar110 = vmaxps_avx(auVar110,auVar106);
    uVar13 = vcmpps_avx512vl(auVar110,auVar100,5);
    uVar14 = vcmpps_avx512vl(auVar109,auVar132,2);
    bVar20 = bVar20 & (byte)uVar13 & (byte)uVar14;
    if (bVar20 != 0) {
      mask_stack[uVar22] = (uint)bVar20;
      BVar2 = (BBox1f)vmovlps_avx(auVar47);
      cu_stack[uVar22] = BVar2;
      BVar2 = (BBox1f)vmovlps_avx(auVar37);
      cv_stack[uVar22] = BVar2;
      uVar22 = (ulong)((int)uVar22 + 1);
    }
  }
  auVar47 = vxorps_avx512vl(auVar89,auVar89);
  auVar260 = ZEXT1664(auVar47);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar267 = ZEXT1664(auVar47);
  auVar110 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar261 = ZEXT3264(auVar110);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar262 = ZEXT1664(auVar47);
  auVar263 = ZEXT3264(_DAT_01fb9fe0);
  auVar110 = _DAT_01fb9fe0;
LAB_018f804a:
  do {
    do {
      do {
        auVar130 = auVar265._0_16_;
        auVar89 = auVar260._0_16_;
        if ((int)uVar22 == 0) {
          if (bVar29) goto LAB_018f8f0d;
          uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar39._4_4_ = uVar125;
          auVar39._0_4_ = uVar125;
          auVar39._8_4_ = uVar125;
          auVar39._12_4_ = uVar125;
          uVar13 = vcmpps_avx512vl(auVar52,auVar39,2);
          uVar27 = (ulong)((uint)uVar27 & (uint)lVar25 & (uint)uVar13);
          goto LAB_018f7007;
        }
        uVar21 = (int)uVar22 - 1;
        uVar6 = mask_stack[uVar21];
        auVar37._8_8_ = 0;
        auVar37._0_4_ = cv_stack[uVar21].lower;
        auVar37._4_4_ = cv_stack[uVar21].upper;
        uVar34 = 0;
        for (uVar26 = (ulong)uVar6; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          uVar34 = uVar34 + 1;
        }
        uVar24 = uVar6 - 1 & uVar6;
        bVar32 = uVar24 == 0;
        mask_stack[uVar21] = uVar24;
        if (bVar32) {
          uVar22 = (ulong)uVar21;
        }
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar34;
        auVar47 = vpunpcklqdq_avx(auVar126,ZEXT416((int)uVar34 + 1));
        auVar47 = vcvtqq2ps_avx512vl(auVar47);
        auVar47 = vmulps_avx512vl(auVar47,auVar262._0_16_);
        fVar228 = cu_stack[uVar21].upper;
        auVar15._4_4_ = fVar228;
        auVar15._0_4_ = fVar228;
        auVar15._8_4_ = fVar228;
        auVar15._12_4_ = fVar228;
        auVar76 = vmulps_avx512vl(auVar47,auVar15);
        auVar47 = vsubps_avx512vl(auVar130,auVar47);
        fVar228 = cu_stack[uVar21].lower;
        auVar16._4_4_ = fVar228;
        auVar16._0_4_ = fVar228;
        auVar16._8_4_ = fVar228;
        auVar16._12_4_ = fVar228;
        auVar47 = vfmadd231ps_avx512vl(auVar76,auVar47,auVar16);
        auVar76 = vmovshdup_avx(auVar47);
        fVar228 = auVar76._0_4_ - auVar47._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar228));
        if (uVar6 == 0 || bVar32) goto LAB_018f7b4b;
        auVar76 = vshufps_avx(auVar37,auVar37,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar228));
        auVar77 = vsubps_avx512vl(auVar130,auVar76);
        fVar213 = auVar76._0_4_;
        auVar156._0_4_ = fVar213 * fVar148;
        fVar223 = auVar76._4_4_;
        auVar156._4_4_ = fVar223 * fVar152;
        fVar224 = auVar76._8_4_;
        auVar156._8_4_ = fVar224 * fVar148;
        fVar225 = auVar76._12_4_;
        auVar156._12_4_ = fVar225 * fVar152;
        auVar174._0_4_ = fVar213 * fVar139;
        auVar174._4_4_ = fVar223 * fVar145;
        auVar174._8_4_ = fVar224 * fVar139;
        auVar174._12_4_ = fVar225 * fVar145;
        auVar180._0_4_ = fVar213 * fVar146;
        auVar180._4_4_ = fVar223 * fVar147;
        auVar180._8_4_ = fVar224 * fVar146;
        auVar180._12_4_ = fVar225 * fVar147;
        auVar140._0_4_ = fVar213 * fVar229;
        auVar140._4_4_ = fVar223 * fVar239;
        auVar140._8_4_ = fVar224 * fVar229;
        auVar140._12_4_ = fVar225 * fVar239;
        auVar76 = vfmadd231ps_fma(auVar156,auVar77,auVar70);
        auVar74 = vfmadd231ps_fma(auVar174,auVar77,auVar48);
        auVar75 = vfmadd231ps_fma(auVar180,auVar77,auVar187);
        auVar77 = vfmadd231ps_fma(auVar140,auVar77,auVar198);
        auVar104._16_16_ = auVar76;
        auVar104._0_16_ = auVar76;
        auVar162._16_16_ = auVar74;
        auVar162._0_16_ = auVar74;
        auVar178._16_16_ = auVar75;
        auVar178._0_16_ = auVar75;
        auVar106 = vpermps_avx512vl(auVar263._0_32_,ZEXT1632(auVar47));
        auVar110 = vsubps_avx(auVar162,auVar104);
        auVar74 = vfmadd213ps_fma(auVar110,auVar106,auVar104);
        auVar110 = vsubps_avx(auVar178,auVar162);
        auVar88 = vfmadd213ps_fma(auVar110,auVar106,auVar162);
        auVar76 = vsubps_avx(auVar77,auVar75);
        auVar163._16_16_ = auVar76;
        auVar163._0_16_ = auVar76;
        auVar76 = vfmadd213ps_fma(auVar163,auVar106,auVar178);
        auVar110 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar110,auVar106,ZEXT1632(auVar74));
        auVar110 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar88));
        auVar76 = vfmadd213ps_fma(auVar110,auVar106,ZEXT1632(auVar88));
        auVar110 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar74));
        auVar154 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar110,auVar106);
        auVar110 = vmulps_avx512vl(auVar110,auVar261._0_32_);
        auVar76 = vmulss_avx512f(ZEXT416((uint)fVar228),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar213 = auVar76._0_4_;
        auVar181._0_8_ =
             CONCAT44(auVar154._4_4_ + fVar213 * auVar110._4_4_,
                      auVar154._0_4_ + fVar213 * auVar110._0_4_);
        auVar181._8_4_ = auVar154._8_4_ + fVar213 * auVar110._8_4_;
        auVar181._12_4_ = auVar154._12_4_ + fVar213 * auVar110._12_4_;
        auVar157._0_4_ = fVar213 * auVar110._16_4_;
        auVar157._4_4_ = fVar213 * auVar110._20_4_;
        auVar157._8_4_ = fVar213 * auVar110._24_4_;
        auVar157._12_4_ = fVar213 * auVar110._28_4_;
        auVar84 = vsubps_avx((undefined1  [16])0x0,auVar157);
        auVar88 = vshufpd_avx(auVar154,auVar154,3);
        auVar85 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar76 = vsubps_avx(auVar88,auVar154);
        auVar74 = vsubps_avx(auVar85,(undefined1  [16])0x0);
        auVar199._0_4_ = auVar76._0_4_ + auVar74._0_4_;
        auVar199._4_4_ = auVar76._4_4_ + auVar74._4_4_;
        auVar199._8_4_ = auVar76._8_4_ + auVar74._8_4_;
        auVar199._12_4_ = auVar76._12_4_ + auVar74._12_4_;
        auVar76 = vshufps_avx(auVar154,auVar154,0xb1);
        auVar74 = vshufps_avx(auVar181,auVar181,0xb1);
        auVar75 = vshufps_avx(auVar84,auVar84,0xb1);
        auVar77 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar249._4_4_ = auVar199._0_4_;
        auVar249._0_4_ = auVar199._0_4_;
        auVar249._8_4_ = auVar199._0_4_;
        auVar249._12_4_ = auVar199._0_4_;
        auVar80 = vshufps_avx(auVar199,auVar199,0x55);
        fVar213 = auVar80._0_4_;
        auVar209._0_4_ = auVar76._0_4_ * fVar213;
        fVar223 = auVar80._4_4_;
        auVar209._4_4_ = auVar76._4_4_ * fVar223;
        fVar224 = auVar80._8_4_;
        auVar209._8_4_ = auVar76._8_4_ * fVar224;
        fVar225 = auVar80._12_4_;
        auVar209._12_4_ = auVar76._12_4_ * fVar225;
        auVar215._0_4_ = auVar74._0_4_ * fVar213;
        auVar215._4_4_ = auVar74._4_4_ * fVar223;
        auVar215._8_4_ = auVar74._8_4_ * fVar224;
        auVar215._12_4_ = auVar74._12_4_ * fVar225;
        auVar232._0_4_ = auVar75._0_4_ * fVar213;
        auVar232._4_4_ = auVar75._4_4_ * fVar223;
        auVar232._8_4_ = auVar75._8_4_ * fVar224;
        auVar232._12_4_ = auVar75._12_4_ * fVar225;
        auVar200._0_4_ = auVar77._0_4_ * fVar213;
        auVar200._4_4_ = auVar77._4_4_ * fVar223;
        auVar200._8_4_ = auVar77._8_4_ * fVar224;
        auVar200._12_4_ = auVar77._12_4_ * fVar225;
        auVar76 = vfmadd231ps_fma(auVar209,auVar249,auVar154);
        auVar74 = vfmadd231ps_fma(auVar215,auVar249,auVar181);
        auVar82 = vfmadd231ps_fma(auVar232,auVar249,auVar84);
        auVar83 = vfmadd231ps_fma(auVar200,(undefined1  [16])0x0,auVar249);
        auVar80 = vshufpd_avx(auVar76,auVar76,1);
        auVar81 = vshufpd_avx(auVar74,auVar74,1);
        auVar78 = vshufpd_avx512vl(auVar82,auVar82,1);
        auVar79 = vshufpd_avx512vl(auVar83,auVar83,1);
        auVar75 = vminss_avx(auVar76,auVar74);
        auVar76 = vmaxss_avx(auVar74,auVar76);
        auVar77 = vminss_avx(auVar82,auVar83);
        auVar74 = vmaxss_avx(auVar83,auVar82);
        auVar75 = vminss_avx(auVar75,auVar77);
        auVar76 = vmaxss_avx(auVar74,auVar76);
        auVar77 = vminss_avx(auVar80,auVar81);
        auVar74 = vmaxss_avx(auVar81,auVar80);
        auVar80 = vminss_avx512f(auVar78,auVar79);
        auVar81 = vmaxss_avx512f(auVar79,auVar78);
        auVar74 = vmaxss_avx(auVar81,auVar74);
        auVar110._0_16_ = vminss_avx512f(auVar77,auVar80);
        vucomiss_avx512f(auVar75);
        fVar223 = auVar74._0_4_;
        fVar213 = auVar76._0_4_;
        if (4 < (uint)uVar22) {
          bVar33 = fVar223 == -0.0001;
          bVar30 = NAN(fVar223);
          if (fVar223 <= -0.0001) goto LAB_018f8272;
          break;
        }
LAB_018f8272:
        auVar77 = vucomiss_avx512f(auVar110._0_16_);
        bVar33 = fVar223 <= -0.0001;
        bVar31 = -0.0001 < fVar213;
        bVar30 = bVar33;
        if (!bVar33) break;
        uVar13 = vcmpps_avx512vl(auVar75,auVar77,5);
        uVar14 = vcmpps_avx512vl(auVar110._0_16_,auVar77,5);
        bVar20 = (byte)uVar13 & (byte)uVar14 & 1;
        bVar33 = bVar31 && bVar20 == 0;
        bVar30 = bVar31 && bVar20 == 0;
      } while (!bVar31 || bVar20 != 0);
      vcmpss_avx512f(auVar75,auVar89,1);
      auVar81 = auVar266._0_16_;
      uVar13 = vcmpss_avx512f(auVar76,auVar89,1);
      bVar31 = (bool)((byte)uVar13 & 1);
      auVar113._16_16_ = auVar110._16_16_;
      auVar113._0_16_ = auVar81;
      iVar124 = auVar266._0_4_;
      auVar112._4_28_ = auVar113._4_28_;
      auVar112._0_4_ = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * iVar124);
      vucomiss_avx512f(auVar112._0_16_);
      bVar30 = (bool)(!bVar33 | bVar30);
      bVar31 = bVar30 == false;
      auVar115._16_16_ = auVar110._16_16_;
      auVar115._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar114._4_28_ = auVar115._4_28_;
      auVar114._0_4_ = (uint)bVar30 * auVar260._0_4_ + (uint)!bVar30 * 0x7f800000;
      auVar80 = auVar114._0_16_;
      auVar117._16_16_ = auVar110._16_16_;
      auVar117._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar116._4_28_ = auVar117._4_28_;
      auVar116._0_4_ = (uint)bVar30 * auVar260._0_4_ + (uint)!bVar30 * -0x800000;
      auVar77 = auVar116._0_16_;
      uVar13 = vcmpss_avx512f(auVar110._0_16_,auVar89,1);
      bVar33 = (bool)((byte)uVar13 & 1);
      auVar119._16_16_ = auVar110._16_16_;
      auVar119._0_16_ = auVar81;
      auVar118._4_28_ = auVar119._4_28_;
      auVar118._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * iVar124);
      vucomiss_avx512f(auVar118._0_16_);
      if ((bVar30) || (bVar31)) {
        auVar82 = vucomiss_avx512f(auVar75);
        if ((bVar30) || (bVar31)) {
          auVar19._8_4_ = 0x80000000;
          auVar19._0_8_ = 0x8000000080000000;
          auVar19._12_4_ = 0x80000000;
          auVar83 = vxorps_avx512vl(auVar75,auVar19);
          auVar75 = vsubss_avx512f(auVar82,auVar75);
          auVar75 = vdivss_avx512f(auVar83,auVar75);
          auVar82 = vsubss_avx512f(auVar81,auVar75);
          auVar75 = vfmadd213ss_avx512f(auVar82,auVar89,auVar75);
          auVar82 = auVar75;
        }
        else {
          auVar82 = vxorps_avx512vl(auVar82,auVar82);
          vucomiss_avx512f(auVar82);
          if ((bVar30) || (auVar75 = auVar81, bVar31)) {
            auVar75 = SUB6416(ZEXT464(0xff800000),0);
            auVar82 = ZEXT416(0x7f800000);
          }
        }
        auVar80 = vminss_avx512f(auVar80,auVar82);
        auVar77 = vmaxss_avx(auVar75,auVar77);
      }
      uVar13 = vcmpss_avx512f(auVar74,auVar89,1);
      bVar33 = (bool)((byte)uVar13 & 1);
      fVar224 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * iVar124);
      if ((auVar112._0_4_ != fVar224) || (NAN(auVar112._0_4_) || NAN(fVar224))) {
        if ((fVar223 != fVar213) || (NAN(fVar223) || NAN(fVar213))) {
          auVar18._8_4_ = 0x80000000;
          auVar18._0_8_ = 0x8000000080000000;
          auVar18._12_4_ = 0x80000000;
          auVar76 = vxorps_avx512vl(auVar76,auVar18);
          auVar201._0_4_ = auVar76._0_4_ / (fVar223 - fVar213);
          auVar201._4_12_ = auVar76._4_12_;
          auVar76 = vsubss_avx512f(auVar81,auVar201);
          auVar76 = vfmadd213ss_avx512f(auVar76,auVar89,auVar201);
          auVar74 = auVar76;
        }
        else if ((fVar213 != 0.0) ||
                (auVar76 = auVar81, auVar74 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar213))) {
          auVar76 = SUB6416(ZEXT464(0xff800000),0);
          auVar74 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar80 = vminss_avx(auVar80,auVar74);
        auVar77 = vmaxss_avx(auVar76,auVar77);
      }
      bVar33 = auVar118._0_4_ != fVar224;
      auVar76 = vminss_avx512f(auVar80,auVar81);
      auVar121._16_16_ = auVar110._16_16_;
      auVar121._0_16_ = auVar80;
      auVar120._4_28_ = auVar121._4_28_;
      auVar120._0_4_ = (uint)bVar33 * auVar76._0_4_ + (uint)!bVar33 * auVar80._0_4_;
      auVar76 = vmaxss_avx512f(auVar81,auVar77);
      auVar123._16_16_ = auVar110._16_16_;
      auVar123._0_16_ = auVar77;
      auVar122._4_28_ = auVar123._4_28_;
      auVar122._0_4_ = (uint)bVar33 * auVar76._0_4_ + (uint)!bVar33 * auVar77._0_4_;
      auVar76 = vmaxss_avx512f(auVar89,auVar120._0_16_);
      auVar110._0_16_ = vminss_avx512f(auVar122._0_16_,auVar81);
    } while (auVar110._0_4_ < auVar76._0_4_);
    auVar82 = vmaxss_avx512f(auVar89,ZEXT416((uint)(auVar76._0_4_ + -0.1)));
    auVar83 = vminss_avx512f(ZEXT416((uint)(auVar110._0_4_ + 0.1)),auVar81);
    auVar141._0_8_ = auVar154._0_8_;
    auVar141._8_8_ = auVar141._0_8_;
    auVar216._8_8_ = auVar181._0_8_;
    auVar216._0_8_ = auVar181._0_8_;
    auVar233._8_8_ = auVar84._0_8_;
    auVar233._0_8_ = auVar84._0_8_;
    auVar76 = vshufpd_avx(auVar181,auVar181,3);
    auVar74 = vshufpd_avx(auVar84,auVar84,3);
    auVar75 = vshufps_avx(auVar82,auVar83,0);
    auVar80 = vsubps_avx512vl(auVar130,auVar75);
    fVar213 = auVar75._0_4_;
    auVar175._0_4_ = fVar213 * auVar88._0_4_;
    fVar223 = auVar75._4_4_;
    auVar175._4_4_ = fVar223 * auVar88._4_4_;
    fVar224 = auVar75._8_4_;
    auVar175._8_4_ = fVar224 * auVar88._8_4_;
    fVar225 = auVar75._12_4_;
    auVar175._12_4_ = fVar225 * auVar88._12_4_;
    auVar182._0_4_ = fVar213 * auVar76._0_4_;
    auVar182._4_4_ = fVar223 * auVar76._4_4_;
    auVar182._8_4_ = fVar224 * auVar76._8_4_;
    auVar182._12_4_ = fVar225 * auVar76._12_4_;
    auVar255._0_4_ = auVar74._0_4_ * fVar213;
    auVar255._4_4_ = auVar74._4_4_ * fVar223;
    auVar255._8_4_ = auVar74._8_4_ * fVar224;
    auVar255._12_4_ = auVar74._12_4_ * fVar225;
    auVar158._0_4_ = fVar213 * auVar85._0_4_;
    auVar158._4_4_ = fVar223 * auVar85._4_4_;
    auVar158._8_4_ = fVar224 * auVar85._8_4_;
    auVar158._12_4_ = fVar225 * auVar85._12_4_;
    auVar77 = vfmadd231ps_fma(auVar175,auVar80,auVar141);
    auVar88 = vfmadd231ps_fma(auVar182,auVar80,auVar216);
    auVar85 = vfmadd231ps_fma(auVar255,auVar80,auVar233);
    auVar80 = vfmadd231ps_fma(auVar158,auVar80,ZEXT816(0));
    auVar74 = vsubss_avx512f(auVar81,auVar82);
    auVar76 = vmovshdup_avx(auVar37);
    auVar154 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar82._0_4_)),auVar37,auVar74);
    auVar74 = vsubss_avx512f(auVar81,auVar83);
    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar83._0_4_)),auVar37,auVar74);
    auVar84 = vdivss_avx512f(auVar81,ZEXT416((uint)fVar228));
    auVar37 = vsubps_avx(auVar88,auVar77);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar74 = vmulps_avx512vl(auVar37,auVar82);
    auVar37 = vsubps_avx(auVar85,auVar88);
    auVar75 = vmulps_avx512vl(auVar37,auVar82);
    auVar37 = vsubps_avx(auVar80,auVar85);
    auVar37 = vmulps_avx512vl(auVar37,auVar82);
    auVar76 = vminps_avx(auVar75,auVar37);
    auVar37 = vmaxps_avx(auVar75,auVar37);
    auVar76 = vminps_avx(auVar74,auVar76);
    auVar37 = vmaxps_avx(auVar74,auVar37);
    auVar74 = vshufpd_avx(auVar76,auVar76,3);
    auVar75 = vshufpd_avx(auVar37,auVar37,3);
    auVar76 = vminps_avx(auVar76,auVar74);
    auVar37 = vmaxps_avx(auVar37,auVar75);
    fVar228 = auVar84._0_4_;
    auVar202._0_4_ = auVar76._0_4_ * fVar228;
    auVar202._4_4_ = auVar76._4_4_ * fVar228;
    auVar202._8_4_ = auVar76._8_4_ * fVar228;
    auVar202._12_4_ = auVar76._12_4_ * fVar228;
    auVar188._0_4_ = fVar228 * auVar37._0_4_;
    auVar188._4_4_ = fVar228 * auVar37._4_4_;
    auVar188._8_4_ = fVar228 * auVar37._8_4_;
    auVar188._12_4_ = fVar228 * auVar37._12_4_;
    auVar84 = vdivss_avx512f(auVar81,ZEXT416((uint)(auVar78._0_4_ - auVar154._0_4_)));
    auVar37 = vshufpd_avx(auVar77,auVar77,3);
    auVar76 = vshufpd_avx(auVar88,auVar88,3);
    auVar74 = vshufpd_avx(auVar85,auVar85,3);
    auVar75 = vshufpd_avx(auVar80,auVar80,3);
    auVar37 = vsubps_avx(auVar37,auVar77);
    auVar77 = vsubps_avx(auVar76,auVar88);
    auVar88 = vsubps_avx(auVar74,auVar85);
    auVar75 = vsubps_avx(auVar75,auVar80);
    auVar76 = vminps_avx(auVar37,auVar77);
    auVar37 = vmaxps_avx(auVar37,auVar77);
    auVar74 = vminps_avx(auVar88,auVar75);
    auVar74 = vminps_avx(auVar76,auVar74);
    auVar76 = vmaxps_avx(auVar88,auVar75);
    auVar37 = vmaxps_avx(auVar37,auVar76);
    fVar228 = auVar84._0_4_;
    auVar234._0_4_ = fVar228 * auVar74._0_4_;
    auVar234._4_4_ = fVar228 * auVar74._4_4_;
    auVar234._8_4_ = fVar228 * auVar74._8_4_;
    auVar234._12_4_ = fVar228 * auVar74._12_4_;
    auVar217._0_4_ = fVar228 * auVar37._0_4_;
    auVar217._4_4_ = fVar228 * auVar37._4_4_;
    auVar217._8_4_ = fVar228 * auVar37._8_4_;
    auVar217._12_4_ = fVar228 * auVar37._12_4_;
    auVar75 = vinsertps_avx(auVar47,auVar154,0x10);
    auVar79 = vpermt2ps_avx512vl(auVar47,_DAT_01fb9f90,auVar78);
    auVar131._0_4_ = auVar75._0_4_ + auVar79._0_4_;
    auVar131._4_4_ = auVar75._4_4_ + auVar79._4_4_;
    auVar131._8_4_ = auVar75._8_4_ + auVar79._8_4_;
    auVar131._12_4_ = auVar75._12_4_ + auVar79._12_4_;
    auVar84 = vmulps_avx512vl(auVar131,auVar267._0_16_);
    auVar76 = vshufps_avx(auVar84,auVar84,0x54);
    uVar125 = auVar84._0_4_;
    auVar134._4_4_ = uVar125;
    auVar134._0_4_ = uVar125;
    auVar134._8_4_ = uVar125;
    auVar134._12_4_ = uVar125;
    auVar74 = vfmadd213ps_fma(auVar53,auVar134,auVar56);
    auVar77 = vfmadd213ps_fma(auVar51,auVar134,auVar55);
    auVar88 = vfmadd213ps_fma(auVar49,auVar134,auVar59);
    auVar37 = vsubps_avx(auVar77,auVar74);
    auVar74 = vfmadd213ps_fma(auVar37,auVar134,auVar74);
    auVar37 = vsubps_avx(auVar88,auVar77);
    auVar37 = vfmadd213ps_fma(auVar37,auVar134,auVar77);
    auVar37 = vsubps_avx(auVar37,auVar74);
    auVar74 = vfmadd231ps_fma(auVar74,auVar37,auVar134);
    auVar85 = vmulps_avx512vl(auVar37,auVar82);
    auVar243._8_8_ = auVar74._0_8_;
    auVar243._0_8_ = auVar74._0_8_;
    auVar37 = vshufpd_avx(auVar74,auVar74,3);
    auVar74 = vshufps_avx(auVar84,auVar84,0x55);
    auVar77 = vsubps_avx(auVar37,auVar243);
    auVar88 = vfmadd231ps_fma(auVar243,auVar74,auVar77);
    auVar256._8_8_ = auVar85._0_8_;
    auVar256._0_8_ = auVar85._0_8_;
    auVar37 = vshufpd_avx(auVar85,auVar85,3);
    auVar37 = vsubps_avx512vl(auVar37,auVar256);
    auVar37 = vfmadd213ps_avx512vl(auVar37,auVar74,auVar256);
    auVar135._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
    auVar135._8_4_ = auVar77._8_4_ ^ 0x80000000;
    auVar135._12_4_ = auVar77._12_4_ ^ 0x80000000;
    auVar74 = vmovshdup_avx512vl(auVar37);
    auVar257._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
    auVar257._8_4_ = auVar74._8_4_ ^ 0x80000000;
    auVar257._12_4_ = auVar74._12_4_ ^ 0x80000000;
    auVar85 = vmovshdup_avx512vl(auVar77);
    auVar80 = vpermt2ps_avx512vl(auVar257,ZEXT416(5),auVar77);
    auVar74 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar74._0_4_ * auVar77._0_4_)),auVar37,auVar85);
    auVar77 = vpermt2ps_avx512vl(auVar37,SUB6416(ZEXT464(4),0),auVar135);
    auVar159._0_4_ = auVar74._0_4_;
    auVar159._4_4_ = auVar159._0_4_;
    auVar159._8_4_ = auVar159._0_4_;
    auVar159._12_4_ = auVar159._0_4_;
    auVar37 = vdivps_avx(auVar80,auVar159);
    auVar86 = vdivps_avx512vl(auVar77,auVar159);
    fVar228 = auVar88._0_4_;
    auVar74 = vshufps_avx(auVar88,auVar88,0x55);
    auVar244._0_4_ = fVar228 * auVar37._0_4_ + auVar74._0_4_ * auVar86._0_4_;
    auVar244._4_4_ = fVar228 * auVar37._4_4_ + auVar74._4_4_ * auVar86._4_4_;
    auVar244._8_4_ = fVar228 * auVar37._8_4_ + auVar74._8_4_ * auVar86._8_4_;
    auVar244._12_4_ = fVar228 * auVar37._12_4_ + auVar74._12_4_ * auVar86._12_4_;
    auVar82 = vsubps_avx(auVar76,auVar244);
    auVar74 = vmovshdup_avx(auVar37);
    auVar76 = vinsertps_avx(auVar202,auVar234,0x1c);
    auVar258._0_4_ = auVar74._0_4_ * auVar76._0_4_;
    auVar258._4_4_ = auVar74._4_4_ * auVar76._4_4_;
    auVar258._8_4_ = auVar74._8_4_ * auVar76._8_4_;
    auVar258._12_4_ = auVar74._12_4_ * auVar76._12_4_;
    auVar83 = vinsertps_avx512f(auVar188,auVar217,0x1c);
    auVar74 = vmulps_avx512vl(auVar74,auVar83);
    auVar80 = vminps_avx512vl(auVar258,auVar74);
    auVar88 = vmaxps_avx(auVar74,auVar258);
    auVar85 = vmovshdup_avx(auVar86);
    auVar74 = vinsertps_avx(auVar234,auVar202,0x4c);
    auVar235._0_4_ = auVar85._0_4_ * auVar74._0_4_;
    auVar235._4_4_ = auVar85._4_4_ * auVar74._4_4_;
    auVar235._8_4_ = auVar85._8_4_ * auVar74._8_4_;
    auVar235._12_4_ = auVar85._12_4_ * auVar74._12_4_;
    auVar77 = vinsertps_avx(auVar217,auVar188,0x4c);
    auVar218._0_4_ = auVar85._0_4_ * auVar77._0_4_;
    auVar218._4_4_ = auVar85._4_4_ * auVar77._4_4_;
    auVar218._8_4_ = auVar85._8_4_ * auVar77._8_4_;
    auVar218._12_4_ = auVar85._12_4_ * auVar77._12_4_;
    auVar85 = vminps_avx(auVar235,auVar218);
    auVar80 = vaddps_avx512vl(auVar80,auVar85);
    auVar85 = vmaxps_avx(auVar218,auVar235);
    auVar219._0_4_ = auVar88._0_4_ + auVar85._0_4_;
    auVar219._4_4_ = auVar88._4_4_ + auVar85._4_4_;
    auVar219._8_4_ = auVar88._8_4_ + auVar85._8_4_;
    auVar219._12_4_ = auVar88._12_4_ + auVar85._12_4_;
    auVar236._8_8_ = 0x3f80000000000000;
    auVar236._0_8_ = 0x3f80000000000000;
    auVar88 = vsubps_avx(auVar236,auVar219);
    auVar85 = vsubps_avx(auVar236,auVar80);
    auVar80 = vsubps_avx(auVar75,auVar84);
    auVar84 = vsubps_avx(auVar79,auVar84);
    fVar225 = auVar80._0_4_;
    auVar259._0_4_ = fVar225 * auVar88._0_4_;
    fVar226 = auVar80._4_4_;
    auVar259._4_4_ = fVar226 * auVar88._4_4_;
    fVar227 = auVar80._8_4_;
    auVar259._8_4_ = fVar227 * auVar88._8_4_;
    fVar164 = auVar80._12_4_;
    auVar259._12_4_ = fVar164 * auVar88._12_4_;
    auVar87 = vbroadcastss_avx512vl(auVar37);
    auVar76 = vmulps_avx512vl(auVar87,auVar76);
    auVar83 = vmulps_avx512vl(auVar87,auVar83);
    auVar87 = vminps_avx512vl(auVar76,auVar83);
    auVar83 = vmaxps_avx512vl(auVar83,auVar76);
    auVar76 = vbroadcastss_avx512vl(auVar86);
    auVar74 = vmulps_avx512vl(auVar76,auVar74);
    auVar76 = vmulps_avx512vl(auVar76,auVar77);
    auVar77 = vminps_avx512vl(auVar74,auVar76);
    auVar77 = vaddps_avx512vl(auVar87,auVar77);
    auVar80 = vmulps_avx512vl(auVar80,auVar85);
    fVar228 = auVar84._0_4_;
    auVar220._0_4_ = fVar228 * auVar88._0_4_;
    fVar213 = auVar84._4_4_;
    auVar220._4_4_ = fVar213 * auVar88._4_4_;
    fVar223 = auVar84._8_4_;
    auVar220._8_4_ = fVar223 * auVar88._8_4_;
    fVar224 = auVar84._12_4_;
    auVar220._12_4_ = fVar224 * auVar88._12_4_;
    auVar237._0_4_ = fVar228 * auVar85._0_4_;
    auVar237._4_4_ = fVar213 * auVar85._4_4_;
    auVar237._8_4_ = fVar223 * auVar85._8_4_;
    auVar237._12_4_ = fVar224 * auVar85._12_4_;
    auVar76 = vmaxps_avx(auVar76,auVar74);
    auVar189._0_4_ = auVar83._0_4_ + auVar76._0_4_;
    auVar189._4_4_ = auVar83._4_4_ + auVar76._4_4_;
    auVar189._8_4_ = auVar83._8_4_ + auVar76._8_4_;
    auVar189._12_4_ = auVar83._12_4_ + auVar76._12_4_;
    auVar203._8_8_ = 0x3f800000;
    auVar203._0_8_ = 0x3f800000;
    auVar76 = vsubps_avx(auVar203,auVar189);
    auVar74 = vsubps_avx512vl(auVar203,auVar77);
    auVar250._0_4_ = fVar225 * auVar76._0_4_;
    auVar250._4_4_ = fVar226 * auVar76._4_4_;
    auVar250._8_4_ = fVar227 * auVar76._8_4_;
    auVar250._12_4_ = fVar164 * auVar76._12_4_;
    auVar245._0_4_ = fVar225 * auVar74._0_4_;
    auVar245._4_4_ = fVar226 * auVar74._4_4_;
    auVar245._8_4_ = fVar227 * auVar74._8_4_;
    auVar245._12_4_ = fVar164 * auVar74._12_4_;
    auVar190._0_4_ = fVar228 * auVar76._0_4_;
    auVar190._4_4_ = fVar213 * auVar76._4_4_;
    auVar190._8_4_ = fVar223 * auVar76._8_4_;
    auVar190._12_4_ = fVar224 * auVar76._12_4_;
    auVar204._0_4_ = fVar228 * auVar74._0_4_;
    auVar204._4_4_ = fVar213 * auVar74._4_4_;
    auVar204._8_4_ = fVar223 * auVar74._8_4_;
    auVar204._12_4_ = fVar224 * auVar74._12_4_;
    auVar76 = vminps_avx(auVar250,auVar245);
    auVar74 = vminps_avx512vl(auVar190,auVar204);
    auVar77 = vminps_avx512vl(auVar76,auVar74);
    auVar76 = vmaxps_avx(auVar245,auVar250);
    auVar74 = vmaxps_avx(auVar204,auVar190);
    auVar74 = vmaxps_avx(auVar74,auVar76);
    auVar88 = vminps_avx512vl(auVar259,auVar80);
    auVar76 = vminps_avx(auVar220,auVar237);
    auVar76 = vminps_avx(auVar88,auVar76);
    auVar76 = vhaddps_avx(auVar77,auVar76);
    auVar110._0_16_ = vmaxps_avx512vl(auVar80,auVar259);
    auVar77 = vmaxps_avx(auVar237,auVar220);
    auVar77 = vmaxps_avx(auVar77,auVar110._0_16_);
    auVar74 = vhaddps_avx(auVar74,auVar77);
    auVar76 = vshufps_avx(auVar76,auVar76,0xe8);
    auVar74 = vshufps_avx(auVar74,auVar74,0xe8);
    auVar191._0_4_ = auVar76._0_4_ + auVar82._0_4_;
    auVar191._4_4_ = auVar76._4_4_ + auVar82._4_4_;
    auVar191._8_4_ = auVar76._8_4_ + auVar82._8_4_;
    auVar191._12_4_ = auVar76._12_4_ + auVar82._12_4_;
    auVar205._0_4_ = auVar74._0_4_ + auVar82._0_4_;
    auVar205._4_4_ = auVar74._4_4_ + auVar82._4_4_;
    auVar205._8_4_ = auVar74._8_4_ + auVar82._8_4_;
    auVar205._12_4_ = auVar74._12_4_ + auVar82._12_4_;
    auVar76 = vmaxps_avx(auVar75,auVar191);
    auVar74 = vminps_avx(auVar205,auVar79);
    uVar34 = vcmpps_avx512vl(auVar74,auVar76,1);
  } while ((uVar34 & 3) != 0);
  uVar34 = vcmpps_avx512vl(auVar205,auVar79,1);
  uVar13 = vcmpps_avx512vl(auVar47,auVar191,1);
  if (((ushort)uVar13 & (ushort)uVar34 & 1) == 0) {
    bVar20 = 0;
  }
  else {
    auVar76 = vmovshdup_avx(auVar191);
    bVar20 = auVar154._0_4_ < auVar76._0_4_ & (byte)(uVar34 >> 1) & 0x7f;
  }
  p03.field_0.i[0] = auVar43._0_4_;
  p03.field_0.i[1] = auVar43._4_4_;
  p03.field_0.i[2] = auVar43._8_4_;
  p03.field_0.i[3] = auVar43._12_4_;
  if (((3 < (uint)uVar22 || uVar6 != 0 && !bVar32) | bVar20) != 1) goto LAB_018f8e97;
  lVar23 = 0xc9;
  do {
    lVar23 = lVar23 + -1;
    if (lVar23 == 0) goto LAB_018f804a;
    auVar47 = vsubss_avx512f(auVar81,auVar82);
    fVar223 = auVar47._0_4_;
    fVar228 = fVar223 * fVar223 * fVar223;
    auVar47 = vmulss_avx512f(auVar82,ZEXT416(0x40400000));
    fVar213 = auVar47._0_4_ * fVar223 * fVar223;
    fVar224 = auVar82._0_4_;
    auVar47 = vmulss_avx512f(ZEXT416((uint)(fVar224 * fVar224)),ZEXT416(0x40400000));
    fVar223 = fVar223 * auVar47._0_4_;
    auVar150._4_4_ = fVar228;
    auVar150._0_4_ = fVar228;
    auVar150._8_4_ = fVar228;
    auVar150._12_4_ = fVar228;
    auVar142._4_4_ = fVar213;
    auVar142._0_4_ = fVar213;
    auVar142._8_4_ = fVar213;
    auVar142._12_4_ = fVar213;
    auVar127._4_4_ = fVar223;
    auVar127._0_4_ = fVar223;
    auVar127._8_4_ = fVar223;
    auVar127._12_4_ = fVar223;
    fVar224 = fVar224 * fVar224 * fVar224;
    auVar176._0_4_ = p03.field_0.v[0] * fVar224;
    auVar176._4_4_ = p03.field_0.v[1] * fVar224;
    auVar176._8_4_ = p03.field_0.v[2] * fVar224;
    auVar176._12_4_ = p03.field_0.v[3] * fVar224;
    auVar47 = vfmadd231ps_fma(auVar176,auVar59,auVar127);
    auVar47 = vfmadd231ps_fma(auVar47,auVar55,auVar142);
    auVar47 = vfmadd231ps_fma(auVar47,auVar56,auVar150);
    auVar128._8_8_ = auVar47._0_8_;
    auVar128._0_8_ = auVar47._0_8_;
    auVar47 = vshufpd_avx(auVar47,auVar47,3);
    auVar76 = vshufps_avx(auVar82,auVar82,0x55);
    auVar47 = vsubps_avx(auVar47,auVar128);
    auVar76 = vfmadd213ps_fma(auVar47,auVar76,auVar128);
    fVar228 = auVar76._0_4_;
    auVar47 = vshufps_avx(auVar76,auVar76,0x55);
    auVar129._0_4_ = auVar37._0_4_ * fVar228 + auVar86._0_4_ * auVar47._0_4_;
    auVar129._4_4_ = auVar37._4_4_ * fVar228 + auVar86._4_4_ * auVar47._4_4_;
    auVar129._8_4_ = auVar37._8_4_ * fVar228 + auVar86._8_4_ * auVar47._8_4_;
    auVar129._12_4_ = auVar37._12_4_ * fVar228 + auVar86._12_4_ * auVar47._12_4_;
    auVar82 = vsubps_avx(auVar82,auVar129);
    auVar47 = vandps_avx512vl(auVar76,auVar264._0_16_);
    auVar110._0_16_ = vprolq_avx512vl(auVar47,0x20);
    auVar47 = vmaxss_avx(auVar110._0_16_,auVar47);
    bVar32 = fVar167 < auVar47._0_4_;
  } while (fVar167 <= auVar47._0_4_);
  auVar47 = vucomiss_avx512f(auVar89);
  if (bVar32) goto LAB_018f804a;
  auVar37 = vucomiss_avx512f(auVar47);
  auVar266 = ZEXT1664(auVar37);
  if (bVar32) goto LAB_018f804a;
  vmovshdup_avx(auVar47);
  auVar37 = vucomiss_avx512f(auVar89);
  if (bVar32) goto LAB_018f804a;
  auVar76 = vucomiss_avx512f(auVar37);
  auVar266 = ZEXT1664(auVar76);
  if (bVar32) goto LAB_018f804a;
  auVar74 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar84 = vinsertps_avx(auVar74,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar74 = vdpps_avx(auVar84,auVar64,0x7f);
  auVar75 = vdpps_avx(auVar84,auVar65,0x7f);
  auVar77 = vdpps_avx(auVar84,auVar66,0x7f);
  auVar88 = vdpps_avx(auVar84,auVar41,0x7f);
  auVar85 = vdpps_avx(auVar84,auVar67,0x7f);
  auVar80 = vdpps_avx(auVar84,auVar68,0x7f);
  auVar81 = vdpps_avx(auVar84,auVar69,0x7f);
  auVar84 = vdpps_avx(auVar84,auVar42,0x7f);
  auVar82 = vsubss_avx512f(auVar76,auVar37);
  fVar228 = auVar37._0_4_;
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar85._0_4_)),auVar82,auVar74);
  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * fVar228)),auVar82,auVar75);
  auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ * fVar228)),auVar82,auVar77);
  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar228 * auVar84._0_4_)),auVar82,auVar88);
  auVar76 = vsubss_avx512f(auVar76,auVar47);
  auVar183._0_4_ = auVar76._0_4_;
  fVar228 = auVar183._0_4_ * auVar183._0_4_ * auVar183._0_4_;
  auVar76 = vmulss_avx512f(auVar47,ZEXT416(0x40400000));
  fVar213 = auVar76._0_4_ * auVar183._0_4_ * auVar183._0_4_;
  local_d8 = auVar47._0_4_;
  auVar160._0_4_ = local_d8 * local_d8;
  auVar160._4_4_ = auVar47._4_4_ * auVar47._4_4_;
  auVar160._8_4_ = auVar47._8_4_ * auVar47._8_4_;
  auVar160._12_4_ = auVar47._12_4_ * auVar47._12_4_;
  auVar110._0_16_ = vmulss_avx512f(auVar160,ZEXT416(0x40400000));
  fVar223 = auVar183._0_4_ * auVar110._0_4_;
  fVar225 = local_d8 * auVar160._0_4_;
  auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * auVar77._0_4_)),ZEXT416((uint)fVar223),auVar75)
  ;
  auVar76 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar213),auVar74);
  auVar37 = vfmadd231ss_fma(auVar76,ZEXT416((uint)fVar228),auVar37);
  fVar224 = auVar37._0_4_;
  if ((fVar224 < fVar153) || (fVar226 = *(float *)(ray + k * 4 + 0x80), fVar226 < fVar224))
  goto LAB_018f804a;
  local_c8 = vshufps_avx(auVar47,auVar47,0x55);
  auVar76 = vsubps_avx512vl(auVar130,local_c8);
  local_268 = auVar61._0_4_;
  fStack_264 = auVar61._4_4_;
  fStack_260 = auVar61._8_4_;
  fStack_25c = auVar61._12_4_;
  fVar227 = local_c8._0_4_;
  auVar206._0_4_ = fVar227 * local_268;
  fVar164 = local_c8._4_4_;
  auVar206._4_4_ = fVar164 * fStack_264;
  fVar165 = local_c8._8_4_;
  auVar206._8_4_ = fVar165 * fStack_260;
  fVar166 = local_c8._12_4_;
  auVar206._12_4_ = fVar166 * fStack_25c;
  local_278 = auVar62._0_4_;
  fStack_274 = auVar62._4_4_;
  fStack_270 = auVar62._8_4_;
  fStack_26c = auVar62._12_4_;
  auVar210._0_4_ = fVar227 * local_278;
  auVar210._4_4_ = fVar164 * fStack_274;
  auVar210._8_4_ = fVar165 * fStack_270;
  auVar210._12_4_ = fVar166 * fStack_26c;
  local_288 = auVar63._0_4_;
  fStack_284 = auVar63._4_4_;
  fStack_280 = auVar63._8_4_;
  fStack_27c = auVar63._12_4_;
  auVar221._0_4_ = fVar227 * local_288;
  auVar221._4_4_ = fVar164 * fStack_284;
  auVar221._8_4_ = fVar165 * fStack_280;
  auVar221._12_4_ = fVar166 * fStack_27c;
  local_298 = auVar45._0_4_;
  fStack_294 = auVar45._4_4_;
  fStack_290 = auVar45._8_4_;
  fStack_28c = auVar45._12_4_;
  auVar238._0_4_ = fVar227 * local_298;
  auVar238._4_4_ = fVar164 * fStack_294;
  auVar238._8_4_ = fVar165 * fStack_290;
  auVar238._12_4_ = fVar166 * fStack_28c;
  auVar47 = vfmadd231ps_fma(auVar206,auVar76,auVar40);
  auVar37 = vfmadd231ps_fma(auVar210,auVar76,auVar57);
  auVar130 = vfmadd231ps_fma(auVar221,auVar76,auVar60);
  auVar76 = vfmadd231ps_fma(auVar238,auVar76,auVar44);
  auVar47 = vsubps_avx(auVar37,auVar47);
  auVar37 = vsubps_avx(auVar130,auVar37);
  auVar130 = vsubps_avx(auVar76,auVar130);
  auVar222._0_4_ = auVar37._0_4_ * local_d8;
  auVar222._4_4_ = auVar37._4_4_ * local_d8;
  auVar222._8_4_ = auVar37._8_4_ * local_d8;
  auVar222._12_4_ = auVar37._12_4_ * local_d8;
  auVar183._4_4_ = auVar183._0_4_;
  auVar183._8_4_ = auVar183._0_4_;
  auVar183._12_4_ = auVar183._0_4_;
  auVar47 = vfmadd231ps_fma(auVar222,auVar183,auVar47);
  auVar192._0_4_ = auVar130._0_4_ * local_d8;
  auVar192._4_4_ = auVar130._4_4_ * local_d8;
  auVar192._8_4_ = auVar130._8_4_ * local_d8;
  auVar192._12_4_ = auVar130._12_4_ * local_d8;
  auVar37 = vfmadd231ps_fma(auVar192,auVar183,auVar37);
  auVar193._0_4_ = auVar37._0_4_ * local_d8;
  auVar193._4_4_ = auVar37._4_4_ * local_d8;
  auVar193._8_4_ = auVar37._8_4_ * local_d8;
  auVar193._12_4_ = auVar37._12_4_ * local_d8;
  auVar47 = vfmadd231ps_fma(auVar193,auVar183,auVar47);
  auVar17._8_4_ = 0x40400000;
  auVar17._0_8_ = 0x4040000040400000;
  auVar17._12_4_ = 0x40400000;
  auVar110._0_16_ = vmulps_avx512vl(auVar47,auVar17);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar20 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_018f8e8c;
    local_2f8 = auVar46._0_4_;
    fStack_2f4 = auVar46._4_4_;
    fStack_2f0 = auVar46._8_4_;
    fStack_2ec = auVar46._12_4_;
    auVar177._0_4_ = fVar225 * local_2f8;
    auVar177._4_4_ = fVar225 * fStack_2f4;
    auVar177._8_4_ = fVar225 * fStack_2f0;
    auVar177._12_4_ = fVar225 * fStack_2ec;
    auVar151._4_4_ = fVar223;
    auVar151._0_4_ = fVar223;
    auVar151._8_4_ = fVar223;
    auVar151._12_4_ = fVar223;
    auVar47 = vfmadd132ps_fma(auVar151,auVar177,auVar72);
    auVar143._4_4_ = fVar213;
    auVar143._0_4_ = fVar213;
    auVar143._8_4_ = fVar213;
    auVar143._12_4_ = fVar213;
    auVar47 = vfmadd132ps_fma(auVar143,auVar47,auVar58);
    auVar136._4_4_ = fVar228;
    auVar136._0_4_ = fVar228;
    auVar136._8_4_ = fVar228;
    auVar136._12_4_ = fVar228;
    auVar130 = vfmadd132ps_fma(auVar136,auVar47,auVar71);
    auVar47 = vshufps_avx(auVar130,auVar130,0xc9);
    auVar37 = vshufps_avx(auVar110._0_16_,auVar110._0_16_,0xc9);
    auVar137._0_4_ = auVar130._0_4_ * auVar37._0_4_;
    auVar137._4_4_ = auVar130._4_4_ * auVar37._4_4_;
    auVar137._8_4_ = auVar130._8_4_ * auVar37._8_4_;
    auVar137._12_4_ = auVar130._12_4_ * auVar37._12_4_;
    auVar37 = vfmsub231ps_fma(auVar137,auVar110._0_16_,auVar47);
    auVar47 = vshufps_avx(auVar37,auVar37,0x55);
    local_f8 = vshufps_avx(auVar37,auVar37,0xaa);
    local_e8 = auVar37._0_4_;
    local_108[0] = (RTCHitN)auVar47[0];
    local_108[1] = (RTCHitN)auVar47[1];
    local_108[2] = (RTCHitN)auVar47[2];
    local_108[3] = (RTCHitN)auVar47[3];
    local_108[4] = (RTCHitN)auVar47[4];
    local_108[5] = (RTCHitN)auVar47[5];
    local_108[6] = (RTCHitN)auVar47[6];
    local_108[7] = (RTCHitN)auVar47[7];
    local_108[8] = (RTCHitN)auVar47[8];
    local_108[9] = (RTCHitN)auVar47[9];
    local_108[10] = (RTCHitN)auVar47[10];
    local_108[0xb] = (RTCHitN)auVar47[0xb];
    local_108[0xc] = (RTCHitN)auVar47[0xc];
    local_108[0xd] = (RTCHitN)auVar47[0xd];
    local_108[0xe] = (RTCHitN)auVar47[0xe];
    local_108[0xf] = (RTCHitN)auVar47[0xf];
    uStack_e4 = local_e8;
    uStack_e0 = local_e8;
    uStack_dc = local_e8;
    fStack_d4 = local_d8;
    fStack_d0 = local_d8;
    fStack_cc = local_d8;
    local_2b8 = auVar39._0_8_;
    uStack_2b0 = auVar39._8_8_;
    local_b8 = local_2b8;
    uStack_b0 = uStack_2b0;
    local_a8 = auVar73;
    vpcmpeqd_avx2(ZEXT1632(auVar73),ZEXT1632(auVar73));
    uStack_94 = context->user->instID[0];
    local_98 = uStack_94;
    uStack_90 = uStack_94;
    uStack_8c = uStack_94;
    uStack_88 = context->user->instPrimID[0];
    uStack_84 = uStack_88;
    uStack_80 = uStack_88;
    uStack_7c = uStack_88;
    *(float *)(ray + k * 4 + 0x80) = fVar224;
    args.valid = (int *)local_378;
    args.geometryUserPtr = pGVar7->userPtr;
    args.context = context->user;
    args.ray = (RTCRayN *)ray;
    args.hit = local_108;
    args.N = 4;
    local_378 = auVar50;
    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      local_368 = lVar25;
      (*pGVar7->occlusionFilterN)(&args);
      auVar263 = ZEXT3264(_DAT_01fb9fe0);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar262 = ZEXT1664(auVar47);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar261 = ZEXT3264(auVar110);
      auVar266 = ZEXT464(0x3f800000);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar267 = ZEXT1664(auVar47);
      auVar47 = vxorps_avx512vl(auVar89,auVar89);
      auVar260 = ZEXT1664(auVar47);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar265 = ZEXT1664(auVar47);
      auVar110._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar264 = ZEXT1664(auVar110._0_16_);
      lVar25 = local_368;
    }
    auVar47 = auVar110._16_16_;
    auVar37 = auVar260._0_16_;
    uVar34 = vptestmd_avx512vl(local_378,local_378);
    if ((uVar34 & 0xf) != 0) {
      p_Var12 = context->args->filter;
      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var12)(&args);
        auVar263 = ZEXT3264(_DAT_01fb9fe0);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar262 = ZEXT1664(auVar47);
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar261 = ZEXT3264(auVar110);
        auVar266 = ZEXT464(0x3f800000);
        auVar47 = auVar110._16_16_;
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar267 = ZEXT1664(auVar89);
        auVar37 = vxorps_avx512vl(auVar37,auVar37);
        auVar260 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar265 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar264 = ZEXT1664(auVar37);
      }
      uVar34 = vptestmd_avx512vl(local_378,local_378);
      uVar34 = uVar34 & 0xf;
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar32 = (bool)((byte)uVar34 & 1);
      auVar90._0_4_ = (uint)bVar32 * auVar37._0_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x80);
      bVar32 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar90._4_4_ = (uint)bVar32 * auVar37._4_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x84);
      bVar32 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar90._8_4_ = (uint)bVar32 * auVar37._8_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x88);
      bVar32 = SUB81(uVar34 >> 3,0);
      auVar90._12_4_ = (uint)bVar32 * auVar37._12_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x8c);
      auVar110._16_16_ = auVar47;
      auVar110._0_16_ = auVar90;
      *(undefined1 (*) [16])(args.ray + 0x80) = auVar90;
      bVar20 = 1;
      if ((byte)uVar34 != 0) goto LAB_018f8e8c;
    }
    *(float *)(ray + k * 4 + 0x80) = fVar226;
  }
  bVar20 = 0;
LAB_018f8e8c:
  bVar29 = (bool)(bVar29 | bVar20);
  goto LAB_018f804a;
LAB_018f8e97:
  auVar37 = vinsertps_avx(auVar154,auVar78,0x10);
  goto LAB_018f7b4b;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }